

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [12];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  byte bVar76;
  byte bVar77;
  byte bVar78;
  ulong uVar79;
  byte bVar80;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ulong uVar81;
  long lVar82;
  bool bVar83;
  ulong uVar84;
  uint uVar85;
  uint uVar128;
  uint uVar129;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar130;
  uint uVar134;
  undefined1 auVar127 [32];
  float pp;
  float fVar135;
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar143 [32];
  float fVar155;
  float fVar159;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar191 [32];
  float fVar197;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar198;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined4 uVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [64];
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar234 [64];
  float fVar240;
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  float fVar245;
  undefined1 auVar244 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_88c;
  ulong local_888;
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  ulong local_7c8;
  RTCFilterFunctionNArguments local_7c0;
  uint local_78c;
  uint local_788;
  undefined4 local_784;
  undefined1 local_780 [16];
  undefined8 local_770;
  float local_768;
  float local_764;
  undefined4 local_760;
  uint local_75c;
  uint local_758;
  uint local_754;
  uint local_750;
  Primitive *local_738;
  ulong local_730;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar123 [32];
  
  PVar8 = prim[1];
  uVar79 = (ulong)(byte)PVar8;
  fVar233 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar93 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar198 = fVar233 * auVar93._0_4_;
  fVar135 = fVar233 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar87);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar241);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar100 = vpmovsxbd_avx2(auVar88);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar101 = vpmovsxbd_avx2(auVar7);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar108 = vpmovsxbd_avx2(auVar86);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102 = vcvtdq2ps_avx(auVar108);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar79 + 6);
  auVar98 = vpmovsxbd_avx2(auVar89);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar84 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar103 = vpmovsxbd_avx2(auVar90);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar84 + uVar79 + 6);
  auVar104 = vpmovsxbd_avx2(auVar92);
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar81 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar96 = vpmovsxbd_avx2(auVar91);
  auVar107 = vcvtdq2ps_avx(auVar96);
  auVar116._4_4_ = fVar135;
  auVar116._0_4_ = fVar135;
  auVar116._8_4_ = fVar135;
  auVar116._12_4_ = fVar135;
  auVar116._16_4_ = fVar135;
  auVar116._20_4_ = fVar135;
  auVar116._24_4_ = fVar135;
  auVar116._28_4_ = fVar135;
  auVar121._8_4_ = 1;
  auVar121._0_8_ = 0x100000001;
  auVar121._12_4_ = 1;
  auVar121._16_4_ = 1;
  auVar121._20_4_ = 1;
  auVar121._24_4_ = 1;
  auVar121._28_4_ = 1;
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar110 = ZEXT1632(CONCAT412(fVar233 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar233 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar233 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar135))));
  auVar109 = vpermps_avx2(auVar121,auVar110);
  auVar95 = vpermps_avx512vl(auVar94,auVar110);
  fVar135 = auVar95._0_4_;
  fVar235 = auVar95._4_4_;
  auVar110._4_4_ = fVar235 * auVar100._4_4_;
  auVar110._0_4_ = fVar135 * auVar100._0_4_;
  fVar236 = auVar95._8_4_;
  auVar110._8_4_ = fVar236 * auVar100._8_4_;
  fVar237 = auVar95._12_4_;
  auVar110._12_4_ = fVar237 * auVar100._12_4_;
  fVar238 = auVar95._16_4_;
  auVar110._16_4_ = fVar238 * auVar100._16_4_;
  fVar239 = auVar95._20_4_;
  auVar110._20_4_ = fVar239 * auVar100._20_4_;
  fVar158 = auVar95._24_4_;
  auVar110._24_4_ = fVar158 * auVar100._24_4_;
  auVar110._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar98._4_4_ * fVar235;
  auVar108._0_4_ = auVar98._0_4_ * fVar135;
  auVar108._8_4_ = auVar98._8_4_ * fVar236;
  auVar108._12_4_ = auVar98._12_4_ * fVar237;
  auVar108._16_4_ = auVar98._16_4_ * fVar238;
  auVar108._20_4_ = auVar98._20_4_ * fVar239;
  auVar108._24_4_ = auVar98._24_4_ * fVar158;
  auVar108._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar107._4_4_ * fVar235;
  auVar96._0_4_ = auVar107._0_4_ * fVar135;
  auVar96._8_4_ = auVar107._8_4_ * fVar236;
  auVar96._12_4_ = auVar107._12_4_ * fVar237;
  auVar96._16_4_ = auVar107._16_4_ * fVar238;
  auVar96._20_4_ = auVar107._20_4_ * fVar239;
  auVar96._24_4_ = auVar107._24_4_ * fVar158;
  auVar96._28_4_ = auVar95._28_4_;
  auVar87 = vfmadd231ps_fma(auVar110,auVar109,auVar99);
  auVar241 = vfmadd231ps_fma(auVar108,auVar109,auVar102);
  auVar88 = vfmadd231ps_fma(auVar96,auVar104,auVar109);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar116,auVar97);
  auVar241 = vfmadd231ps_fma(ZEXT1632(auVar241),auVar116,auVar101);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar103,auVar116);
  auVar120._4_4_ = fVar198;
  auVar120._0_4_ = fVar198;
  auVar120._8_4_ = fVar198;
  auVar120._12_4_ = fVar198;
  auVar120._16_4_ = fVar198;
  auVar120._20_4_ = fVar198;
  auVar120._24_4_ = fVar198;
  auVar120._28_4_ = fVar198;
  auVar250 = ZEXT3264(auVar120);
  auVar96 = ZEXT1632(CONCAT412(fVar233 * auVar93._12_4_,
                               CONCAT48(fVar233 * auVar93._8_4_,
                                        CONCAT44(fVar233 * auVar93._4_4_,fVar198))));
  auVar108 = vpermps_avx2(auVar121,auVar96);
  auVar96 = vpermps_avx512vl(auVar94,auVar96);
  fVar233 = auVar96._0_4_;
  fVar135 = auVar96._4_4_;
  auVar109._4_4_ = fVar135 * auVar100._4_4_;
  auVar109._0_4_ = fVar233 * auVar100._0_4_;
  fVar235 = auVar96._8_4_;
  auVar109._8_4_ = fVar235 * auVar100._8_4_;
  fVar236 = auVar96._12_4_;
  auVar109._12_4_ = fVar236 * auVar100._12_4_;
  fVar237 = auVar96._16_4_;
  auVar109._16_4_ = fVar237 * auVar100._16_4_;
  fVar238 = auVar96._20_4_;
  auVar109._20_4_ = fVar238 * auVar100._20_4_;
  fVar239 = auVar96._24_4_;
  auVar109._24_4_ = fVar239 * auVar100._24_4_;
  auVar109._28_4_ = 1;
  auVar94._4_4_ = auVar98._4_4_ * fVar135;
  auVar94._0_4_ = auVar98._0_4_ * fVar233;
  auVar94._8_4_ = auVar98._8_4_ * fVar235;
  auVar94._12_4_ = auVar98._12_4_ * fVar236;
  auVar94._16_4_ = auVar98._16_4_ * fVar237;
  auVar94._20_4_ = auVar98._20_4_ * fVar238;
  auVar94._24_4_ = auVar98._24_4_ * fVar239;
  auVar94._28_4_ = auVar100._28_4_;
  auVar98._4_4_ = auVar107._4_4_ * fVar135;
  auVar98._0_4_ = auVar107._0_4_ * fVar233;
  auVar98._8_4_ = auVar107._8_4_ * fVar235;
  auVar98._12_4_ = auVar107._12_4_ * fVar236;
  auVar98._16_4_ = auVar107._16_4_ * fVar237;
  auVar98._20_4_ = auVar107._20_4_ * fVar238;
  auVar98._24_4_ = auVar107._24_4_ * fVar239;
  auVar98._28_4_ = auVar96._28_4_;
  auVar7 = vfmadd231ps_fma(auVar109,auVar108,auVar99);
  auVar86 = vfmadd231ps_fma(auVar94,auVar108,auVar102);
  auVar89 = vfmadd231ps_fma(auVar98,auVar108,auVar104);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar120,auVar97);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar120,auVar101);
  auVar192._8_4_ = 0x7fffffff;
  auVar192._0_8_ = 0x7fffffff7fffffff;
  auVar192._12_4_ = 0x7fffffff;
  auVar192._16_4_ = 0x7fffffff;
  auVar192._20_4_ = 0x7fffffff;
  auVar192._24_4_ = 0x7fffffff;
  auVar192._28_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar120,auVar103);
  auVar97 = vandps_avx(ZEXT1632(auVar87),auVar192);
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar115._16_4_ = 0x219392ef;
  auVar115._20_4_ = 0x219392ef;
  auVar115._24_4_ = 0x219392ef;
  auVar115._28_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar97,auVar115,1);
  bVar11 = (bool)((byte)uVar84 & 1);
  auVar95._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._0_4_;
  bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._4_4_;
  bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._8_4_;
  bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar87._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar241),auVar192);
  uVar84 = vcmpps_avx512vl(auVar97,auVar115,1);
  bVar11 = (bool)((byte)uVar84 & 1);
  auVar111._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar241._0_4_;
  bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar241._4_4_;
  bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar241._8_4_;
  bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar241._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar88),auVar192);
  uVar84 = vcmpps_avx512vl(auVar97,auVar115,1);
  bVar11 = (bool)((byte)uVar84 & 1);
  auVar112._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar88._0_4_;
  bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar88._4_4_;
  bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar88._8_4_;
  bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar88._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar95);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = &DAT_3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar95,auVar97,auVar117);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar111);
  auVar241 = vfnmadd213ps_fma(auVar111,auVar97,auVar117);
  auVar241 = vfmadd132ps_fma(ZEXT1632(auVar241),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar112);
  auVar88 = vfnmadd213ps_fma(auVar112,auVar97,auVar117);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar97,auVar97);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar7));
  auVar103._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar103._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar103._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar103._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar103._16_4_ = auVar97._16_4_ * 0.0;
  auVar103._20_4_ = auVar97._20_4_ * 0.0;
  auVar103._24_4_ = auVar97._24_4_ * 0.0;
  auVar103._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar7));
  auVar98 = vpbroadcastd_avx512vl();
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar177._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar177._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar177._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar177._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar177._16_4_ = auVar97._16_4_ * 0.0;
  auVar177._20_4_ = auVar97._20_4_ * 0.0;
  auVar177._24_4_ = auVar97._24_4_ * 0.0;
  auVar177._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar8 * 0x10 + uVar79 * -2 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar86));
  auVar104._4_4_ = auVar241._4_4_ * auVar97._4_4_;
  auVar104._0_4_ = auVar241._0_4_ * auVar97._0_4_;
  auVar104._8_4_ = auVar241._8_4_ * auVar97._8_4_;
  auVar104._12_4_ = auVar241._12_4_ * auVar97._12_4_;
  auVar104._16_4_ = auVar97._16_4_ * 0.0;
  auVar104._20_4_ = auVar97._20_4_ * 0.0;
  auVar104._24_4_ = auVar97._24_4_ * 0.0;
  auVar104._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar99);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar86));
  auVar114._0_4_ = auVar241._0_4_ * auVar97._0_4_;
  auVar114._4_4_ = auVar241._4_4_ * auVar97._4_4_;
  auVar114._8_4_ = auVar241._8_4_ * auVar97._8_4_;
  auVar114._12_4_ = auVar241._12_4_ * auVar97._12_4_;
  auVar114._16_4_ = auVar97._16_4_ * 0.0;
  auVar114._20_4_ = auVar97._20_4_ * 0.0;
  auVar114._24_4_ = auVar97._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 + uVar79 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar89));
  auVar107._4_4_ = auVar97._4_4_ * auVar88._4_4_;
  auVar107._0_4_ = auVar97._0_4_ * auVar88._0_4_;
  auVar107._8_4_ = auVar97._8_4_ * auVar88._8_4_;
  auVar107._12_4_ = auVar97._12_4_ * auVar88._12_4_;
  auVar107._16_4_ = auVar97._16_4_ * 0.0;
  auVar107._20_4_ = auVar97._20_4_ * 0.0;
  auVar107._24_4_ = auVar97._24_4_ * 0.0;
  auVar107._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar89));
  auVar113._0_4_ = auVar88._0_4_ * auVar97._0_4_;
  auVar113._4_4_ = auVar88._4_4_ * auVar97._4_4_;
  auVar113._8_4_ = auVar88._8_4_ * auVar97._8_4_;
  auVar113._12_4_ = auVar88._12_4_ * auVar97._12_4_;
  auVar113._16_4_ = auVar97._16_4_ * 0.0;
  auVar113._20_4_ = auVar97._20_4_ * 0.0;
  auVar113._24_4_ = auVar97._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar103,auVar177);
  auVar99 = vpminsd_avx2(auVar104,auVar114);
  auVar97 = vmaxps_avx(auVar97,auVar99);
  auVar99 = vpminsd_avx2(auVar107,auVar113);
  uVar229 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar100._4_4_ = uVar229;
  auVar100._0_4_ = uVar229;
  auVar100._8_4_ = uVar229;
  auVar100._12_4_ = uVar229;
  auVar100._16_4_ = uVar229;
  auVar100._20_4_ = uVar229;
  auVar100._24_4_ = uVar229;
  auVar100._28_4_ = uVar229;
  auVar99 = vmaxps_avx512vl(auVar99,auVar100);
  auVar97 = vmaxps_avx(auVar97,auVar99);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  auVar99._16_4_ = 0x3f7ffffa;
  auVar99._20_4_ = 0x3f7ffffa;
  auVar99._24_4_ = 0x3f7ffffa;
  auVar99._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar97,auVar99);
  auVar97 = vpmaxsd_avx2(auVar103,auVar177);
  auVar99 = vpmaxsd_avx2(auVar104,auVar114);
  auVar97 = vminps_avx(auVar97,auVar99);
  auVar99 = vpmaxsd_avx2(auVar107,auVar113);
  fVar233 = (ray->super_RayK<1>).tfar;
  auVar101._4_4_ = fVar233;
  auVar101._0_4_ = fVar233;
  auVar101._8_4_ = fVar233;
  auVar101._12_4_ = fVar233;
  auVar101._16_4_ = fVar233;
  auVar101._20_4_ = fVar233;
  auVar101._24_4_ = fVar233;
  auVar101._28_4_ = fVar233;
  auVar99 = vminps_avx512vl(auVar99,auVar101);
  auVar97 = vminps_avx(auVar97,auVar99);
  auVar102._8_4_ = 0x3f800003;
  auVar102._0_8_ = 0x3f8000033f800003;
  auVar102._12_4_ = 0x3f800003;
  auVar102._16_4_ = 0x3f800003;
  auVar102._20_4_ = 0x3f800003;
  auVar102._24_4_ = 0x3f800003;
  auVar102._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar102);
  uVar21 = vpcmpgtd_avx512vl(auVar98,_DAT_0205a920);
  uVar20 = vcmpps_avx512vl(local_3c0,auVar97,2);
  if ((byte)((byte)uVar20 & (byte)uVar21) == 0) {
    return;
  }
  local_728 = (ulong)(byte)((byte)uVar20 & (byte)uVar21);
  auVar247 = ZEXT864(0) << 0x20;
  local_738 = prim;
LAB_01e02f5c:
  lVar82 = 0;
  for (uVar84 = local_728; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  local_888 = (ulong)*(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_848 = (ulong)*(uint *)(prim + lVar82 * 4 + 6);
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar82 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar82 = *(long *)&pGVar9[1].time_range.upper;
  auVar87 = *(undefined1 (*) [16])(lVar82 + (long)p_Var10 * uVar84);
  auVar241 = *(undefined1 (*) [16])(lVar82 + (uVar84 + 1) * (long)p_Var10);
  auVar88 = *(undefined1 (*) [16])(lVar82 + (uVar84 + 2) * (long)p_Var10);
  local_728 = local_728 - 1 & local_728;
  auVar7 = *(undefined1 (*) [16])(lVar82 + (uVar84 + 3) * (long)p_Var10);
  if (local_728 != 0) {
    uVar81 = local_728 - 1 & local_728;
    for (uVar84 = local_728; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
    }
    if (uVar81 != 0) {
      for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar217._0_4_ = auVar87._0_4_ + auVar241._0_4_ + auVar88._0_4_ + auVar7._0_4_;
  auVar217._4_4_ = auVar87._4_4_ + auVar241._4_4_ + auVar88._4_4_ + auVar7._4_4_;
  auVar217._8_4_ = auVar87._8_4_ + auVar241._8_4_ + auVar88._8_4_ + auVar7._8_4_;
  auVar217._12_4_ = auVar87._12_4_ + auVar241._12_4_ + auVar88._12_4_ + auVar7._12_4_;
  aVar5 = (ray->super_RayK<1>).org.field_0;
  aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar93._8_4_ = 0x3e800000;
  auVar93._0_8_ = 0x3e8000003e800000;
  auVar93._12_4_ = 0x3e800000;
  local_480._16_16_ = auVar97._16_16_;
  auVar86 = vmulps_avx512vl(auVar217,auVar93);
  auVar86 = vsubps_avx(auVar86,(undefined1  [16])aVar5);
  auVar86 = vdpps_avx(auVar86,(undefined1  [16])aVar6,0x7f);
  auVar89 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  auVar230._4_12_ = auVar247._4_12_;
  auVar230._0_4_ = auVar89._0_4_;
  local_480._0_16_ = vrcp14ss_avx512f(auVar247._0_16_,auVar230);
  auVar89 = vfnmadd213ss_fma(local_480._0_16_,auVar89,ZEXT416(0x40000000));
  fVar233 = auVar86._0_4_ * local_480._0_4_ * auVar89._0_4_;
  local_610 = ZEXT416((uint)fVar233);
  auVar225._4_4_ = fVar233;
  auVar225._0_4_ = fVar233;
  auVar225._8_4_ = fVar233;
  auVar225._12_4_ = fVar233;
  fStack_650 = fVar233;
  _local_660 = auVar225;
  fStack_64c = fVar233;
  fStack_648 = fVar233;
  fStack_644 = fVar233;
  auVar86 = vfmadd231ps_fma((undefined1  [16])aVar5,(undefined1  [16])aVar6,auVar225);
  auVar86 = vblendps_avx(auVar86,auVar247._0_16_,8);
  auVar87 = vsubps_avx(auVar87,auVar86);
  uVar229 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar229;
  local_520._0_4_ = uVar229;
  local_520._8_4_ = uVar229;
  local_520._12_4_ = uVar229;
  local_520._16_4_ = uVar229;
  local_520._20_4_ = uVar229;
  local_520._24_4_ = uVar229;
  local_520._28_4_ = uVar229;
  auVar232 = ZEXT3264(local_520);
  auVar88 = vsubps_avx(auVar88,auVar86);
  uVar229 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_540._4_4_ = uVar229;
  local_540._0_4_ = uVar229;
  local_540._8_4_ = uVar229;
  local_540._12_4_ = uVar229;
  local_540._16_4_ = uVar229;
  local_540._20_4_ = uVar229;
  local_540._24_4_ = uVar229;
  local_540._28_4_ = uVar229;
  auVar234 = ZEXT3264(local_540);
  local_560 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  auVar241 = vsubps_avx(auVar241,auVar86);
  auVar243 = ZEXT1664(auVar241);
  auVar7 = vsubps_avx(auVar7,auVar86);
  auVar220 = ZEXT1664(auVar7);
  local_1a0 = auVar87._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar143._8_4_ = 1;
  auVar143._0_8_ = 0x100000001;
  auVar143._12_4_ = 1;
  auVar143._16_4_ = 1;
  auVar143._20_4_ = 1;
  auVar143._24_4_ = 1;
  auVar143._28_4_ = 1;
  local_680 = ZEXT1632(auVar87);
  local_1c0 = vpermps_avx2(auVar143,local_680);
  auVar176._8_4_ = 2;
  auVar176._0_8_ = 0x200000002;
  auVar176._12_4_ = 2;
  auVar176._16_4_ = 2;
  auVar176._20_4_ = 2;
  auVar176._24_4_ = 2;
  auVar176._28_4_ = 2;
  local_1e0 = vpermps_avx2(auVar176,local_680);
  auVar191._8_4_ = 4.2039e-45;
  auVar191._0_8_ = 0x300000003;
  auVar191._12_4_ = 4.2039e-45;
  auVar191._16_4_ = 4.2039e-45;
  auVar191._20_4_ = 4.2039e-45;
  auVar191._24_4_ = 4.2039e-45;
  auVar191._28_4_ = 4.2039e-45;
  local_200 = vpermps_avx2(auVar191,local_680);
  local_220 = auVar241._0_4_;
  uStack_21c = local_220;
  uStack_218 = local_220;
  uStack_214 = local_220;
  uStack_210 = local_220;
  uStack_20c = local_220;
  uStack_208 = local_220;
  uStack_204 = local_220;
  local_6c0 = ZEXT1632(auVar241);
  local_240 = vpermps_avx2(auVar143,local_6c0);
  local_260 = vpermps_avx2(auVar176,local_6c0);
  local_280 = vpermps_avx2(auVar191,local_6c0);
  local_2a0 = auVar88._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_6a0 = ZEXT1632(auVar88);
  local_2c0 = vpermps_avx2(auVar143,local_6a0);
  local_2e0 = vpermps_avx2(auVar176,local_6a0);
  local_300 = vpermps_avx2(auVar191,local_6a0);
  local_320 = auVar7._0_4_;
  uStack_31c = local_320;
  uStack_318 = local_320;
  uStack_314 = local_320;
  uStack_310 = local_320;
  uStack_30c = local_320;
  uStack_308 = local_320;
  uStack_304 = local_320;
  _local_6e0 = ZEXT1632(auVar7);
  local_340 = vpermps_avx2(auVar143,_local_6e0);
  local_360 = vpermps_avx2(auVar176,_local_6e0);
  local_380 = vpermps_avx2(auVar191,_local_6e0);
  auVar97 = vpermps_avx2(auVar176,ZEXT1632(CONCAT412(aVar6.field_3.w * aVar6.field_3.w,
                                                     CONCAT48(aVar6.z * aVar6.z,
                                                              CONCAT44(aVar6.y * aVar6.y,
                                                                       aVar6.x * aVar6.x)))));
  auVar87 = vfmadd231ps_fma(auVar97,local_540,local_540);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_520,local_520);
  local_3a0 = ZEXT1632(auVar87);
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar87),auVar122);
  local_730 = 1;
  local_7c8 = 0;
  auVar216 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar87 = vmovshdup_avx(auVar216._0_16_);
    local_820._0_4_ = auVar216._0_4_;
    fVar245 = auVar87._0_4_ - (float)local_820._0_4_;
    fVar19 = fVar245 * 0.04761905;
    local_780 = auVar216._0_16_;
    local_820._4_4_ = local_820._0_4_;
    local_820._8_4_ = local_820._0_4_;
    local_820._12_4_ = local_820._0_4_;
    local_820._16_4_ = local_820._0_4_;
    local_820._20_4_ = local_820._0_4_;
    local_820._24_4_ = local_820._0_4_;
    local_820._28_4_ = local_820._0_4_;
    local_880._4_4_ = fVar245;
    local_880._0_4_ = fVar245;
    local_880._8_4_ = fVar245;
    local_880._12_4_ = fVar245;
    local_880._16_4_ = fVar245;
    local_880._20_4_ = fVar245;
    local_880._24_4_ = fVar245;
    local_880._28_4_ = fVar245;
    auVar87 = vfmadd231ps_fma(local_820,local_880,_DAT_02020f20);
    auVar117 = auVar206._0_32_;
    auVar97 = vsubps_avx(auVar117,ZEXT1632(auVar87));
    fVar233 = auVar97._0_4_;
    fVar235 = auVar97._4_4_;
    fVar237 = auVar97._8_4_;
    fVar239 = auVar97._12_4_;
    fVar198 = auVar97._16_4_;
    fVar240 = auVar97._20_4_;
    fVar18 = auVar97._24_4_;
    fVar136 = fVar233 * fVar233 * fVar233;
    fVar153 = fVar235 * fVar235 * fVar235;
    auVar39._4_4_ = fVar153;
    auVar39._0_4_ = fVar136;
    fVar154 = fVar237 * fVar237 * fVar237;
    auVar39._8_4_ = fVar154;
    fVar155 = fVar239 * fVar239 * fVar239;
    auVar39._12_4_ = fVar155;
    fVar156 = fVar198 * fVar198 * fVar198;
    auVar39._16_4_ = fVar156;
    fVar157 = fVar240 * fVar240 * fVar240;
    auVar39._20_4_ = fVar157;
    fVar159 = fVar18 * fVar18 * fVar18;
    auVar39._24_4_ = fVar159;
    auVar39._28_4_ = fVar245;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar39,auVar98);
    fVar135 = auVar87._0_4_;
    fVar236 = auVar87._4_4_;
    fVar238 = auVar87._8_4_;
    fVar158 = auVar87._12_4_;
    fVar180 = fVar135 * fVar135 * fVar135;
    fVar195 = fVar236 * fVar236 * fVar236;
    fVar196 = fVar238 * fVar238 * fVar238;
    fVar197 = fVar158 * fVar158 * fVar158;
    auVar64._28_4_ = auVar191._28_4_;
    auVar64._0_28_ = ZEXT1628(CONCAT412(fVar197,CONCAT48(fVar196,CONCAT44(fVar195,fVar180))));
    auVar216._0_4_ = fVar135 * fVar233;
    auVar216._4_4_ = fVar236 * fVar235;
    auVar216._8_4_ = fVar238 * fVar237;
    auVar216._12_4_ = fVar158 * fVar239;
    auVar216._16_4_ = fVar198 * 0.0;
    auVar216._20_4_ = fVar240 * 0.0;
    auVar216._28_36_ = auVar243._28_36_;
    auVar216._24_4_ = fVar18 * 0.0;
    auVar100 = vmulps_avx512vl(auVar64,auVar98);
    fVar245 = auVar100._28_4_ + fVar245;
    auVar40._4_4_ = fVar153 * 0.16666667;
    auVar40._0_4_ = fVar136 * 0.16666667;
    auVar40._8_4_ = fVar154 * 0.16666667;
    auVar40._12_4_ = fVar155 * 0.16666667;
    auVar40._16_4_ = fVar156 * 0.16666667;
    auVar40._20_4_ = fVar157 * 0.16666667;
    auVar40._24_4_ = fVar159 * 0.16666667;
    auVar40._28_4_ = fVar245;
    auVar41._4_4_ =
         (auVar216._4_4_ * fVar235 * 12.0 + auVar216._4_4_ * fVar236 * 6.0 + fVar195 + auVar99._4_4_
         ) * 0.16666667;
    auVar41._0_4_ =
         (auVar216._0_4_ * fVar233 * 12.0 + auVar216._0_4_ * fVar135 * 6.0 + fVar180 + auVar99._0_4_
         ) * 0.16666667;
    auVar41._8_4_ =
         (auVar216._8_4_ * fVar237 * 12.0 + auVar216._8_4_ * fVar238 * 6.0 + fVar196 + auVar99._8_4_
         ) * 0.16666667;
    auVar41._12_4_ =
         (auVar216._12_4_ * fVar239 * 12.0 + auVar216._12_4_ * fVar158 * 6.0 +
         fVar197 + auVar99._12_4_) * 0.16666667;
    auVar41._16_4_ =
         (auVar216._16_4_ * fVar198 * 12.0 + auVar216._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar41._20_4_ =
         (auVar216._20_4_ * fVar240 * 12.0 + auVar216._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar41._24_4_ =
         (auVar216._24_4_ * fVar18 * 12.0 + auVar216._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar41._28_4_ = auVar247._28_4_;
    auVar42._4_4_ =
         (auVar100._4_4_ + fVar153 +
         auVar216._4_4_ * fVar236 * 12.0 + auVar216._4_4_ * fVar235 * 6.0) * 0.16666667;
    auVar42._0_4_ =
         (auVar100._0_4_ + fVar136 +
         auVar216._0_4_ * fVar135 * 12.0 + auVar216._0_4_ * fVar233 * 6.0) * 0.16666667;
    auVar42._8_4_ =
         (auVar100._8_4_ + fVar154 +
         auVar216._8_4_ * fVar238 * 12.0 + auVar216._8_4_ * fVar237 * 6.0) * 0.16666667;
    auVar42._12_4_ =
         (auVar100._12_4_ + fVar155 +
         auVar216._12_4_ * fVar158 * 12.0 + auVar216._12_4_ * fVar239 * 6.0) * 0.16666667;
    auVar42._16_4_ =
         (auVar100._16_4_ + fVar156 + auVar216._16_4_ * 0.0 * 12.0 + auVar216._16_4_ * fVar198 * 6.0
         ) * 0.16666667;
    auVar42._20_4_ =
         (auVar100._20_4_ + fVar157 + auVar216._20_4_ * 0.0 * 12.0 + auVar216._20_4_ * fVar240 * 6.0
         ) * 0.16666667;
    auVar42._24_4_ =
         (auVar100._24_4_ + fVar159 + auVar216._24_4_ * 0.0 * 12.0 + auVar216._24_4_ * fVar18 * 6.0)
         * 0.16666667;
    auVar42._28_4_ = auVar250._28_4_;
    auVar43._28_4_ = fVar245 + auVar247._28_4_ + auVar220._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar197 * 0.16666667,
                            CONCAT48(fVar196 * 0.16666667,
                                     CONCAT44(fVar195 * 0.16666667,fVar180 * 0.16666667))));
    auVar72._4_4_ = uStack_31c;
    auVar72._0_4_ = local_320;
    auVar72._8_4_ = uStack_318;
    auVar72._12_4_ = uStack_314;
    auVar72._16_4_ = uStack_310;
    auVar72._20_4_ = uStack_30c;
    auVar72._24_4_ = uStack_308;
    auVar72._28_4_ = uStack_304;
    auVar99 = vmulps_avx512vl(auVar72,auVar43);
    auVar100 = vmulps_avx512vl(local_340,auVar43);
    auVar101 = vmulps_avx512vl(local_360,auVar43);
    auVar102 = vmulps_avx512vl(local_380,auVar43);
    auVar73._4_4_ = uStack_29c;
    auVar73._0_4_ = local_2a0;
    auVar73._8_4_ = uStack_298;
    auVar73._12_4_ = uStack_294;
    auVar73._16_4_ = uStack_290;
    auVar73._20_4_ = uStack_28c;
    auVar73._24_4_ = uStack_288;
    auVar73._28_4_ = uStack_284;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar42,auVar73);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar42,local_2c0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar42,local_2e0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_300,auVar42);
    auVar74._4_4_ = uStack_21c;
    auVar74._0_4_ = local_220;
    auVar74._8_4_ = uStack_218;
    auVar74._12_4_ = uStack_214;
    auVar74._16_4_ = uStack_210;
    auVar74._20_4_ = uStack_20c;
    auVar74._24_4_ = uStack_208;
    auVar74._28_4_ = uStack_204;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar41,auVar74);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar41,local_240);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar41,local_260);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_280,auVar41);
    auVar75._4_4_ = uStack_19c;
    auVar75._0_4_ = local_1a0;
    auVar75._8_4_ = uStack_198;
    auVar75._12_4_ = uStack_194;
    auVar75._16_4_ = uStack_190;
    auVar75._20_4_ = uStack_18c;
    auVar75._24_4_ = uStack_188;
    auVar75._28_4_ = uStack_184;
    auVar241 = vfmadd231ps_fma(auVar99,auVar40,auVar75);
    auVar88 = vfmadd231ps_fma(auVar100,auVar40,local_1c0);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar40,local_1e0);
    auVar100 = vfmadd231ps_avx512vl(auVar102,local_200,auVar40);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar101 = vxorps_avx512vl(auVar97,auVar99);
    auVar102 = vxorps_avx512vl(ZEXT1632(auVar87),auVar99);
    auVar211._0_4_ = auVar102._0_4_ * fVar135;
    auVar211._4_4_ = auVar102._4_4_ * fVar236;
    auVar211._8_4_ = auVar102._8_4_ * fVar238;
    auVar211._12_4_ = auVar102._12_4_ * fVar158;
    auVar211._16_4_ = auVar102._16_4_ * 0.0;
    auVar211._20_4_ = auVar102._20_4_ * 0.0;
    auVar211._24_4_ = auVar102._24_4_ * 0.0;
    auVar211._28_4_ = 0;
    auVar104 = vmulps_avx512vl(auVar216._0_32_,auVar98);
    auVar99 = vsubps_avx(auVar211,auVar104);
    auVar44._4_4_ = auVar101._4_4_ * fVar235 * 0.5;
    auVar44._0_4_ = auVar101._0_4_ * fVar233 * 0.5;
    auVar44._8_4_ = auVar101._8_4_ * fVar237 * 0.5;
    auVar44._12_4_ = auVar101._12_4_ * fVar239 * 0.5;
    auVar44._16_4_ = auVar101._16_4_ * fVar198 * 0.5;
    auVar44._20_4_ = auVar101._20_4_ * fVar240 * 0.5;
    auVar44._24_4_ = auVar101._24_4_ * fVar18 * 0.5;
    auVar44._28_4_ = auVar97._28_4_;
    auVar45._4_4_ = auVar99._4_4_ * 0.5;
    auVar45._0_4_ = auVar99._0_4_ * 0.5;
    auVar45._8_4_ = auVar99._8_4_ * 0.5;
    auVar45._12_4_ = auVar99._12_4_ * 0.5;
    auVar45._16_4_ = auVar99._16_4_ * 0.5;
    auVar45._20_4_ = auVar99._20_4_ * 0.5;
    auVar45._24_4_ = auVar99._24_4_ * 0.5;
    auVar45._28_4_ = auVar99._28_4_;
    auVar46._4_4_ = (fVar235 * fVar235 + auVar104._4_4_) * 0.5;
    auVar46._0_4_ = (fVar233 * fVar233 + auVar104._0_4_) * 0.5;
    auVar46._8_4_ = (fVar237 * fVar237 + auVar104._8_4_) * 0.5;
    auVar46._12_4_ = (fVar239 * fVar239 + auVar104._12_4_) * 0.5;
    auVar46._16_4_ = (fVar198 * fVar198 + auVar104._16_4_) * 0.5;
    auVar46._20_4_ = (fVar240 * fVar240 + auVar104._20_4_) * 0.5;
    auVar46._24_4_ = (fVar18 * fVar18 + auVar104._24_4_) * 0.5;
    auVar46._28_4_ = auVar232._28_4_ + auVar104._28_4_;
    auVar47._28_4_ = auVar234._28_4_;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar158 * fVar158 * 0.5,
                            CONCAT48(fVar238 * fVar238 * 0.5,
                                     CONCAT44(fVar236 * fVar236 * 0.5,fVar135 * fVar135 * 0.5))));
    auVar97 = vmulps_avx512vl(auVar72,auVar47);
    auVar99 = vmulps_avx512vl(local_340,auVar47);
    auVar101 = vmulps_avx512vl(local_360,auVar47);
    auVar104 = vmulps_avx512vl(local_380,auVar47);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar46,auVar73);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar46,local_2c0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar46,local_2e0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_300,auVar46);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar45,auVar74);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar45,local_240);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar45,local_260);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_280,auVar45);
    auVar87 = vfmadd231ps_fma(auVar97,auVar44,auVar75);
    auVar7 = vfmadd231ps_fma(auVar99,auVar44,local_1c0);
    auVar97 = vfmadd231ps_avx512vl(auVar101,auVar44,local_1e0);
    auVar99 = vfmadd231ps_avx512vl(auVar104,local_200,auVar44);
    auVar48._4_4_ = auVar87._4_4_ * fVar19;
    auVar48._0_4_ = auVar87._0_4_ * fVar19;
    auVar48._8_4_ = auVar87._8_4_ * fVar19;
    auVar48._12_4_ = auVar87._12_4_ * fVar19;
    auVar48._16_4_ = fVar19 * 0.0;
    auVar48._20_4_ = fVar19 * 0.0;
    auVar48._24_4_ = fVar19 * 0.0;
    auVar48._28_4_ = auVar102._28_4_;
    auVar246._0_4_ = auVar7._0_4_ * fVar19;
    auVar246._4_4_ = auVar7._4_4_ * fVar19;
    auVar246._8_4_ = auVar7._8_4_ * fVar19;
    auVar246._12_4_ = auVar7._12_4_ * fVar19;
    auVar246._16_4_ = fVar19 * 0.0;
    auVar246._20_4_ = fVar19 * 0.0;
    auVar246._24_4_ = fVar19 * 0.0;
    auVar246._28_4_ = 0;
    auVar49._4_4_ = auVar97._4_4_ * fVar19;
    auVar49._0_4_ = auVar97._0_4_ * fVar19;
    auVar49._8_4_ = auVar97._8_4_ * fVar19;
    auVar49._12_4_ = auVar97._12_4_ * fVar19;
    auVar49._16_4_ = auVar97._16_4_ * fVar19;
    auVar49._20_4_ = auVar97._20_4_ * fVar19;
    auVar49._24_4_ = auVar97._24_4_ * fVar19;
    auVar49._28_4_ = auVar97._28_4_;
    auVar250 = ZEXT3264(auVar49);
    auVar223._0_4_ = auVar99._0_4_ * fVar19;
    auVar223._4_4_ = auVar99._4_4_ * fVar19;
    auVar223._8_4_ = auVar99._8_4_ * fVar19;
    auVar223._12_4_ = auVar99._12_4_ * fVar19;
    auVar223._16_4_ = auVar99._16_4_ * fVar19;
    auVar223._20_4_ = auVar99._20_4_ * fVar19;
    auVar223._24_4_ = auVar99._24_4_ * fVar19;
    auVar223._28_4_ = 0;
    auVar87 = vxorps_avx512vl(local_380._0_16_,local_380._0_16_);
    auVar104 = vpermt2ps_avx512vl(ZEXT1632(auVar241),_DAT_0205fd20,ZEXT1632(auVar87));
    auVar232 = ZEXT3264(auVar104);
    auVar105 = vpermt2ps_avx512vl(ZEXT1632(auVar88),_DAT_0205fd20,ZEXT1632(auVar87));
    auVar101 = ZEXT1632(auVar87);
    auVar106 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,auVar101);
    auVar212._0_4_ = auVar223._0_4_ + auVar100._0_4_;
    auVar212._4_4_ = auVar223._4_4_ + auVar100._4_4_;
    auVar212._8_4_ = auVar223._8_4_ + auVar100._8_4_;
    auVar212._12_4_ = auVar223._12_4_ + auVar100._12_4_;
    auVar212._16_4_ = auVar223._16_4_ + auVar100._16_4_;
    auVar212._20_4_ = auVar223._20_4_ + auVar100._20_4_;
    auVar212._24_4_ = auVar223._24_4_ + auVar100._24_4_;
    auVar212._28_4_ = auVar100._28_4_ + 0.0;
    auVar97 = vmaxps_avx(auVar100,auVar212);
    auVar99 = vminps_avx(auVar100,auVar212);
    auVar107 = vpermt2ps_avx512vl(auVar100,_DAT_0205fd20,auVar101);
    auVar108 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar101);
    auVar96 = vpermt2ps_avx512vl(auVar246,_DAT_0205fd20,auVar101);
    auVar115 = ZEXT1632(auVar87);
    auVar109 = vpermt2ps_avx512vl(auVar49,_DAT_0205fd20,auVar115);
    auVar100 = vpermt2ps_avx512vl(auVar223,_DAT_0205fd20,auVar115);
    auVar110 = vsubps_avx512vl(auVar107,auVar100);
    auVar100 = vsubps_avx(auVar104,ZEXT1632(auVar241));
    auVar101 = vsubps_avx(auVar105,ZEXT1632(auVar88));
    auVar102 = vsubps_avx(auVar106,auVar103);
    auVar220 = ZEXT3264(auVar102);
    auVar94 = vmulps_avx512vl(auVar101,auVar49);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar246,auVar102);
    auVar95 = vmulps_avx512vl(auVar102,auVar48);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar49,auVar100);
    auVar111 = vmulps_avx512vl(auVar100,auVar246);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar48,auVar101);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar95 = vfmadd231ps_avx512vl(auVar111,auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar95 = vmulps_avx512vl(auVar102,auVar102);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar101);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar100);
    auVar111 = vrcp14ps_avx512vl(auVar95);
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar95,auVar117);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar94 = vmulps_avx512vl(auVar94,auVar111);
    auVar112 = vmulps_avx512vl(auVar101,auVar109);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar96,auVar102);
    auVar113 = vmulps_avx512vl(auVar102,auVar108);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar109,auVar100);
    auVar114 = vmulps_avx512vl(auVar100,auVar96);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar108,auVar101);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar94 = vmaxps_avx512vl(auVar94,auVar111);
    auVar94 = vsqrtps_avx512vl(auVar94);
    auVar111 = vmaxps_avx512vl(auVar110,auVar107);
    auVar97 = vmaxps_avx512vl(auVar97,auVar111);
    auVar111 = vaddps_avx512vl(auVar94,auVar97);
    auVar97 = vminps_avx512vl(auVar110,auVar107);
    auVar97 = vminps_avx(auVar99,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar94);
    auVar25._8_4_ = 0x3f800002;
    auVar25._0_8_ = 0x3f8000023f800002;
    auVar25._12_4_ = 0x3f800002;
    auVar25._16_4_ = 0x3f800002;
    auVar25._20_4_ = 0x3f800002;
    auVar25._24_4_ = 0x3f800002;
    auVar25._28_4_ = 0x3f800002;
    auVar99 = vmulps_avx512vl(auVar111,auVar25);
    auVar26._8_4_ = 0x3f7ffffc;
    auVar26._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar26._12_4_ = 0x3f7ffffc;
    auVar26._16_4_ = 0x3f7ffffc;
    auVar26._20_4_ = 0x3f7ffffc;
    auVar26._24_4_ = 0x3f7ffffc;
    auVar26._28_4_ = 0x3f7ffffc;
    local_700 = vmulps_avx512vl(auVar97,auVar26);
    auVar50._4_4_ = auVar99._4_4_ * auVar99._4_4_;
    auVar50._0_4_ = auVar99._0_4_ * auVar99._0_4_;
    auVar50._8_4_ = auVar99._8_4_ * auVar99._8_4_;
    auVar50._12_4_ = auVar99._12_4_ * auVar99._12_4_;
    auVar50._16_4_ = auVar99._16_4_ * auVar99._16_4_;
    auVar50._20_4_ = auVar99._20_4_ * auVar99._20_4_;
    auVar50._24_4_ = auVar99._24_4_ * auVar99._24_4_;
    auVar50._28_4_ = local_700._28_4_;
    auVar97 = vrsqrt14ps_avx512vl(auVar95);
    auVar27._8_4_ = 0xbf000000;
    auVar27._0_8_ = 0xbf000000bf000000;
    auVar27._12_4_ = 0xbf000000;
    auVar27._16_4_ = 0xbf000000;
    auVar27._20_4_ = 0xbf000000;
    auVar27._24_4_ = 0xbf000000;
    auVar27._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar95,auVar27);
    auVar51._4_4_ = auVar97._4_4_ * auVar99._4_4_;
    auVar51._0_4_ = auVar97._0_4_ * auVar99._0_4_;
    auVar51._8_4_ = auVar97._8_4_ * auVar99._8_4_;
    auVar51._12_4_ = auVar97._12_4_ * auVar99._12_4_;
    auVar51._16_4_ = auVar97._16_4_ * auVar99._16_4_;
    auVar51._20_4_ = auVar97._20_4_ * auVar99._20_4_;
    auVar51._24_4_ = auVar97._24_4_ * auVar99._24_4_;
    auVar51._28_4_ = auVar99._28_4_;
    auVar99 = vmulps_avx512vl(auVar97,auVar97);
    auVar99 = vmulps_avx512vl(auVar99,auVar51);
    auVar28._8_4_ = 0x3fc00000;
    auVar28._0_8_ = 0x3fc000003fc00000;
    auVar28._12_4_ = 0x3fc00000;
    auVar28._16_4_ = 0x3fc00000;
    auVar28._20_4_ = 0x3fc00000;
    auVar28._24_4_ = 0x3fc00000;
    auVar28._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar28);
    auVar52._4_4_ = auVar99._4_4_ * auVar100._4_4_;
    auVar52._0_4_ = auVar99._0_4_ * auVar100._0_4_;
    auVar52._8_4_ = auVar99._8_4_ * auVar100._8_4_;
    auVar52._12_4_ = auVar99._12_4_ * auVar100._12_4_;
    auVar52._16_4_ = auVar99._16_4_ * auVar100._16_4_;
    auVar52._20_4_ = auVar99._20_4_ * auVar100._20_4_;
    auVar52._24_4_ = auVar99._24_4_ * auVar100._24_4_;
    auVar52._28_4_ = auVar97._28_4_;
    auVar97 = vmulps_avx512vl(auVar101,auVar99);
    auVar107 = vmulps_avx512vl(auVar102,auVar99);
    auVar192 = ZEXT1632(auVar241);
    auVar110 = vsubps_avx512vl(auVar115,auVar192);
    auVar177 = ZEXT1632(auVar88);
    auVar94 = vsubps_avx512vl(auVar115,auVar177);
    auVar95 = vsubps_avx512vl(auVar115,auVar103);
    auVar67._4_4_ = uStack_55c;
    auVar67._0_4_ = local_560;
    auVar67._8_4_ = uStack_558;
    auVar67._12_4_ = uStack_554;
    auVar67._16_4_ = uStack_550;
    auVar67._20_4_ = uStack_54c;
    auVar67._24_4_ = uStack_548;
    auVar67._28_4_ = uStack_544;
    auVar111 = vmulps_avx512vl(auVar67,auVar95);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_540,auVar94);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_520,auVar110);
    auVar112 = vmulps_avx512vl(auVar95,auVar95);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar94,auVar94);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar67,auVar107);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar97,local_540);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar52,local_520);
    auVar107 = vmulps_avx512vl(auVar95,auVar107);
    auVar97 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar52);
    local_640 = vmulps_avx512vl(auVar113,auVar113);
    auVar114 = vsubps_avx512vl(local_3a0,local_640);
    auVar97 = vmulps_avx512vl(auVar113,auVar107);
    auVar97 = vsubps_avx512vl(auVar111,auVar97);
    auVar111 = vaddps_avx512vl(auVar97,auVar97);
    auVar97 = vmulps_avx512vl(auVar107,auVar107);
    local_840 = vsubps_avx512vl(auVar112,auVar97);
    auVar112 = vsubps_avx512vl(local_840,auVar50);
    local_720 = vmulps_avx512vl(auVar111,auVar111);
    auVar98 = vmulps_avx512vl(auVar114,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar112);
    auVar97 = vsubps_avx512vl(local_720,auVar97);
    uVar84 = vcmpps_avx512vl(auVar97,auVar115,5);
    bVar76 = (byte)uVar84;
    if (bVar76 == 0) {
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar118 = auVar97;
    }
    else {
      auVar97 = vsqrtps_avx512vl(auVar97);
      auVar115 = vaddps_avx512vl(auVar114,auVar114);
      auVar116 = vrcp14ps_avx512vl(auVar115);
      auVar117 = vfnmadd213ps_avx512vl(auVar115,auVar116,auVar117);
      auVar117 = vfmadd132ps_avx512vl(auVar117,auVar116,auVar116);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      auVar115 = vxorps_avx512vl(auVar111,auVar29);
      auVar115 = vsubps_avx512vl(auVar115,auVar97);
      auVar115 = vmulps_avx512vl(auVar115,auVar117);
      auVar97 = vsubps_avx512vl(auVar97,auVar111);
      auVar97 = vmulps_avx512vl(auVar97,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar113,auVar115,auVar107);
      local_4c0 = vmulps_avx512vl(auVar99,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar113,auVar97,auVar107);
      local_4e0 = vmulps_avx512vl(auVar99,auVar117);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117 = vblendmps_avx512vl(auVar117,auVar115);
      auVar119._0_4_ =
           (uint)(bVar76 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar76 & 1) * local_4e0._0_4_;
      bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar11 * auVar117._4_4_ | (uint)!bVar11 * local_4e0._4_4_;
      bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar11 * auVar117._8_4_ | (uint)!bVar11 * local_4e0._8_4_;
      bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * local_4e0._12_4_;
      bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar11 * auVar117._16_4_ | (uint)!bVar11 * local_4e0._16_4_;
      bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar11 * auVar117._20_4_ | (uint)!bVar11 * local_4e0._20_4_;
      bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar11 * auVar117._24_4_ | (uint)!bVar11 * local_4e0._24_4_;
      bVar11 = SUB81(uVar84 >> 7,0);
      auVar119._28_4_ = (uint)bVar11 * auVar117._28_4_ | (uint)!bVar11 * local_4e0._28_4_;
      auVar203._8_4_ = 0xff800000;
      auVar203._0_8_ = 0xff800000ff800000;
      auVar203._12_4_ = 0xff800000;
      auVar203._16_4_ = 0xff800000;
      auVar203._20_4_ = 0xff800000;
      auVar203._24_4_ = 0xff800000;
      auVar203._28_4_ = 0xff800000;
      auVar117 = vblendmps_avx512vl(auVar203,auVar97);
      auVar118._0_4_ =
           (uint)(bVar76 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar97._0_4_;
      bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar11 * auVar117._4_4_ | (uint)!bVar11 * auVar97._4_4_;
      bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar11 * auVar117._8_4_ | (uint)!bVar11 * auVar97._8_4_;
      bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * auVar97._12_4_;
      bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar11 * auVar117._16_4_ | (uint)!bVar11 * auVar97._16_4_;
      bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar11 * auVar117._20_4_ | (uint)!bVar11 * auVar97._20_4_;
      bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar11 * auVar117._24_4_ | (uint)!bVar11 * auVar97._24_4_;
      bVar11 = SUB81(uVar84 >> 7,0);
      auVar118._28_4_ = (uint)bVar11 * auVar117._28_4_ | (uint)!bVar11 * auVar97._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_640,auVar117);
      auVar97 = vmaxps_avx512vl(local_480,auVar117);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      auVar97 = vmulps_avx512vl(auVar97,auVar30);
      vandps_avx512vl(auVar114,auVar117);
      uVar81 = vcmpps_avx512vl(auVar97,auVar97,1);
      uVar84 = uVar84 & uVar81;
      bVar80 = (byte)uVar84;
      if (bVar80 != 0) {
        uVar81 = vcmpps_avx512vl(auVar112,_DAT_02020f00,2);
        auVar215._8_4_ = 0xff800000;
        auVar215._0_8_ = 0xff800000ff800000;
        auVar215._12_4_ = 0xff800000;
        auVar215._16_4_ = 0xff800000;
        auVar215._20_4_ = 0xff800000;
        auVar215._24_4_ = 0xff800000;
        auVar215._28_4_ = 0xff800000;
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar117 = vblendmps_avx512vl(auVar112,auVar215);
        bVar78 = (byte)uVar81;
        uVar85 = (uint)(bVar78 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar97._0_4_;
        bVar11 = (bool)((byte)(uVar81 >> 1) & 1);
        uVar128 = (uint)bVar11 * auVar117._4_4_ | (uint)!bVar11 * auVar97._4_4_;
        bVar11 = (bool)((byte)(uVar81 >> 2) & 1);
        uVar129 = (uint)bVar11 * auVar117._8_4_ | (uint)!bVar11 * auVar97._8_4_;
        bVar11 = (bool)((byte)(uVar81 >> 3) & 1);
        uVar130 = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * auVar97._12_4_;
        bVar11 = (bool)((byte)(uVar81 >> 4) & 1);
        uVar131 = (uint)bVar11 * auVar117._16_4_ | (uint)!bVar11 * auVar97._16_4_;
        bVar11 = (bool)((byte)(uVar81 >> 5) & 1);
        uVar132 = (uint)bVar11 * auVar117._20_4_ | (uint)!bVar11 * auVar97._20_4_;
        bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
        uVar133 = (uint)bVar11 * auVar117._24_4_ | (uint)!bVar11 * auVar97._24_4_;
        bVar11 = SUB81(uVar81 >> 7,0);
        uVar134 = (uint)bVar11 * auVar117._28_4_ | (uint)!bVar11 * auVar97._28_4_;
        auVar119._0_4_ = (bVar80 & 1) * uVar85 | !(bool)(bVar80 & 1) * auVar119._0_4_;
        bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar119._4_4_ = bVar11 * uVar128 | !bVar11 * auVar119._4_4_;
        bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar119._8_4_ = bVar11 * uVar129 | !bVar11 * auVar119._8_4_;
        bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar119._12_4_ = bVar11 * uVar130 | !bVar11 * auVar119._12_4_;
        bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar119._16_4_ = bVar11 * uVar131 | !bVar11 * auVar119._16_4_;
        bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar119._20_4_ = bVar11 * uVar132 | !bVar11 * auVar119._20_4_;
        bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar119._24_4_ = bVar11 * uVar133 | !bVar11 * auVar119._24_4_;
        bVar11 = SUB81(uVar84 >> 7,0);
        auVar119._28_4_ = bVar11 * uVar134 | !bVar11 * auVar119._28_4_;
        auVar112 = vblendmps_avx512vl(auVar215,auVar112);
        bVar11 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar81 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        bVar17 = SUB81(uVar81 >> 7,0);
        auVar97._0_4_ =
             (uint)(bVar80 & 1) *
             ((uint)(bVar78 & 1) * auVar112._0_4_ | !(bool)(bVar78 & 1) * uVar85) |
             !(bool)(bVar80 & 1) * auVar118._0_4_;
        bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar97._4_4_ =
             (uint)bVar83 * ((uint)bVar11 * auVar112._4_4_ | !bVar11 * uVar128) |
             !bVar83 * auVar118._4_4_;
        bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar97._8_4_ =
             (uint)bVar11 * ((uint)bVar12 * auVar112._8_4_ | !bVar12 * uVar129) |
             !bVar11 * auVar118._8_4_;
        bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar97._12_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar112._12_4_ | !bVar13 * uVar130) |
             !bVar11 * auVar118._12_4_;
        bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar97._16_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar112._16_4_ | !bVar14 * uVar131) |
             !bVar11 * auVar118._16_4_;
        bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar97._20_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar112._20_4_ | !bVar15 * uVar132) |
             !bVar11 * auVar118._20_4_;
        bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar97._24_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar112._24_4_ | !bVar16 * uVar133) |
             !bVar11 * auVar118._24_4_;
        bVar11 = SUB81(uVar84 >> 7,0);
        auVar97._28_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar112._28_4_ | !bVar17 * uVar134) |
             !bVar11 * auVar118._28_4_;
        bVar76 = (~bVar80 | bVar78) & bVar76;
        auVar118 = auVar97;
      }
      auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    if ((bVar76 & 0x7f) == 0) {
LAB_01e03c59:
      auVar243 = ZEXT3264(auVar106);
      auVar234 = ZEXT3264(auVar105);
      auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar143 = auVar206._0_32_;
      auVar87 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_610);
      auVar204._0_4_ = auVar87._0_4_;
      auVar204._4_4_ = auVar204._0_4_;
      auVar204._8_4_ = auVar204._0_4_;
      auVar204._12_4_ = auVar204._0_4_;
      auVar204._16_4_ = auVar204._0_4_;
      auVar204._20_4_ = auVar204._0_4_;
      auVar204._24_4_ = auVar204._0_4_;
      auVar204._28_4_ = auVar204._0_4_;
      auVar97 = vmaxps_avx512vl(auVar204,auVar119);
      auVar87 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_610);
      auVar213._0_4_ = auVar87._0_4_;
      auVar213._4_4_ = auVar213._0_4_;
      auVar213._8_4_ = auVar213._0_4_;
      auVar213._12_4_ = auVar213._0_4_;
      auVar213._16_4_ = auVar213._0_4_;
      auVar213._20_4_ = auVar213._0_4_;
      auVar213._24_4_ = auVar213._0_4_;
      auVar213._28_4_ = auVar213._0_4_;
      auVar112 = vminps_avx512vl(auVar213,auVar118);
      auVar95 = vmulps_avx512vl(auVar49,auVar95);
      auVar94 = vfmadd213ps_avx512vl(auVar94,auVar246,auVar95);
      auVar110 = vfmadd213ps_avx512vl(auVar110,auVar48,auVar94);
      auVar68._4_4_ = uStack_55c;
      auVar68._0_4_ = local_560;
      auVar68._8_4_ = uStack_558;
      auVar68._12_4_ = uStack_554;
      auVar68._16_4_ = uStack_550;
      auVar68._20_4_ = uStack_54c;
      auVar68._24_4_ = uStack_548;
      auVar68._28_4_ = uStack_544;
      auVar94 = vmulps_avx512vl(auVar68,auVar49);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_540,auVar246);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_520,auVar48);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar94,auVar117);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar117,auVar115,1);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar110 = vxorps_avx512vl(auVar110,auVar116);
      auVar95 = vrcp14ps_avx512vl(auVar94);
      auVar120 = vxorps_avx512vl(auVar94,auVar116);
      auVar121 = vfnmadd213ps_avx512vl(auVar95,auVar94,auVar143);
      auVar121 = vfmadd132ps_avx512vl(auVar121,auVar95,auVar95);
      auVar110 = vmulps_avx512vl(auVar121,auVar110);
      uVar21 = vcmpps_avx512vl(auVar94,auVar120,1);
      bVar80 = (byte)uVar20 | (byte)uVar21;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar110,auVar121);
      auVar123._0_4_ =
           (uint)(bVar80 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar95._0_4_;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar11 * auVar122._4_4_ | (uint)!bVar11 * auVar95._4_4_;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar11 * auVar122._8_4_ | (uint)!bVar11 * auVar95._8_4_;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar11 * auVar122._12_4_ | (uint)!bVar11 * auVar95._12_4_;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar11 * auVar122._16_4_ | (uint)!bVar11 * auVar95._16_4_;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar11 * auVar122._20_4_ | (uint)!bVar11 * auVar95._20_4_;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar11 * auVar122._24_4_ | (uint)!bVar11 * auVar95._24_4_;
      auVar123._28_4_ =
           (uint)(bVar80 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar95._28_4_;
      auVar97 = vmaxps_avx(auVar97,auVar123);
      uVar21 = vcmpps_avx512vl(auVar94,auVar120,6);
      bVar80 = (byte)uVar20 | (byte)uVar21;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124._0_4_ =
           (uint)(bVar80 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar110._0_4_;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar11 * auVar120._4_4_ | (uint)!bVar11 * auVar110._4_4_;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar11 * auVar120._8_4_ | (uint)!bVar11 * auVar110._8_4_;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar11 * auVar120._12_4_ | (uint)!bVar11 * auVar110._12_4_;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar11 * auVar120._16_4_ | (uint)!bVar11 * auVar110._16_4_;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar11 * auVar120._20_4_ | (uint)!bVar11 * auVar110._20_4_;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar11 * auVar120._24_4_ | (uint)!bVar11 * auVar110._24_4_;
      auVar124._28_4_ =
           (uint)(bVar80 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar110._28_4_;
      auVar110 = vminps_avx(auVar112,auVar124);
      auVar250 = ZEXT864(0) << 0x20;
      auVar104 = vsubps_avx(ZEXT832(0) << 0x20,auVar104);
      auVar94 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
      auVar95 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar95 = vmulps_avx512vl(auVar95,auVar109);
      auVar94 = vfnmsub231ps_avx512vl(auVar95,auVar96,auVar94);
      auVar104 = vfnmadd231ps_avx512vl(auVar94,auVar108,auVar104);
      auVar109 = vmulps_avx512vl(auVar68,auVar109);
      auVar109 = vfnmsub231ps_avx512vl(auVar109,local_540,auVar96);
      auVar108 = vfnmadd231ps_avx512vl(auVar109,local_520,auVar108);
      vandps_avx512vl(auVar108,auVar117);
      uVar20 = vcmpps_avx512vl(auVar108,auVar115,1);
      auVar104 = vxorps_avx512vl(auVar104,auVar116);
      auVar109 = vrcp14ps_avx512vl(auVar108);
      auVar94 = vxorps_avx512vl(auVar108,auVar116);
      auVar95 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar143);
      auVar87 = vfmadd132ps_fma(auVar95,auVar109,auVar109);
      fVar233 = auVar87._0_4_ * auVar104._0_4_;
      fVar135 = auVar87._4_4_ * auVar104._4_4_;
      auVar53._4_4_ = fVar135;
      auVar53._0_4_ = fVar233;
      fVar235 = auVar87._8_4_ * auVar104._8_4_;
      auVar53._8_4_ = fVar235;
      fVar236 = auVar87._12_4_ * auVar104._12_4_;
      auVar53._12_4_ = fVar236;
      fVar237 = auVar104._16_4_ * 0.0;
      auVar53._16_4_ = fVar237;
      fVar238 = auVar104._20_4_ * 0.0;
      auVar53._20_4_ = fVar238;
      fVar239 = auVar104._24_4_ * 0.0;
      auVar53._24_4_ = fVar239;
      auVar53._28_4_ = auVar104._28_4_;
      uVar21 = vcmpps_avx512vl(auVar108,auVar94,1);
      bVar80 = (byte)uVar20 | (byte)uVar21;
      auVar95 = vblendmps_avx512vl(auVar53,auVar121);
      auVar106._0_4_ =
           (uint)(bVar80 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar109._0_4_;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar106._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar109._4_4_;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar106._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar109._8_4_;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar106._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar109._12_4_;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar106._16_4_ = (uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * auVar109._16_4_;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar106._20_4_ = (uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * auVar109._20_4_;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar106._24_4_ = (uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * auVar109._24_4_;
      auVar106._28_4_ =
           (uint)(bVar80 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar109._28_4_;
      _local_5a0 = vmaxps_avx(auVar97,auVar106);
      uVar21 = vcmpps_avx512vl(auVar108,auVar94,6);
      bVar80 = (byte)uVar20 | (byte)uVar21;
      auVar105._0_4_ =
           (uint)(bVar80 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar80 & 1) * (int)fVar233;
      bVar11 = (bool)(bVar80 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar11 * auVar120._4_4_ | (uint)!bVar11 * (int)fVar135;
      bVar11 = (bool)(bVar80 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar11 * auVar120._8_4_ | (uint)!bVar11 * (int)fVar235;
      bVar11 = (bool)(bVar80 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar11 * auVar120._12_4_ | (uint)!bVar11 * (int)fVar236;
      bVar11 = (bool)(bVar80 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar11 * auVar120._16_4_ | (uint)!bVar11 * (int)fVar237;
      bVar11 = (bool)(bVar80 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar11 * auVar120._20_4_ | (uint)!bVar11 * (int)fVar238;
      bVar11 = (bool)(bVar80 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar11 * auVar120._24_4_ | (uint)!bVar11 * (int)fVar239;
      auVar105._28_4_ =
           (uint)(bVar80 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar104._28_4_;
      local_400 = vminps_avx(auVar110,auVar105);
      auVar232 = ZEXT3264(local_400);
      auVar104 = _local_5a0;
      uVar20 = vcmpps_avx512vl(_local_5a0,local_400,2);
      bVar76 = bVar76 & 0x7f & (byte)uVar20;
      if (bVar76 == 0) {
        auVar206 = ZEXT3264(auVar143);
        auVar97 = auVar143;
        goto LAB_01e03c59;
      }
      auVar97 = vmaxps_avx(ZEXT832(0) << 0x20,local_700);
      auVar108 = vminps_avx512vl(local_4c0,auVar143);
      auVar61 = ZEXT412(0);
      auVar109 = ZEXT1232(auVar61) << 0x20;
      auVar108 = vmaxps_avx(auVar108,ZEXT1232(auVar61) << 0x20);
      auVar110 = vminps_avx512vl(local_4e0,auVar143);
      auVar54._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar108._28_4_ + 7.0;
      local_4c0 = vfmadd213ps_avx512vl(auVar54,local_880,local_820);
      auVar108 = vmaxps_avx(auVar110,ZEXT1232(auVar61) << 0x20);
      auVar55._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar108._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar55,local_880,local_820);
      auVar56._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar56._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar56._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar56._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar56._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar56._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar56._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar56._28_4_ = local_4e0._28_4_;
      auVar108 = vsubps_avx(local_840,auVar56);
      auVar97 = vmulps_avx512vl(auVar98,auVar108);
      auVar98 = vsubps_avx(local_720,auVar97);
      uVar20 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar61) << 0x20,5);
      bVar80 = (byte)uVar20;
      auVar110 = ZEXT1232(ZEXT812(0)) << 0x20;
      if (bVar80 == 0) {
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar206 = ZEXT864(0) << 0x20;
        auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar234 = ZEXT864(0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
      }
      else {
        auVar88 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
        uVar84 = vcmpps_avx512vl(auVar98,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar97 = vsqrtps_avx(auVar98);
        auVar214._0_4_ = auVar114._0_4_ + auVar114._0_4_;
        auVar214._4_4_ = auVar114._4_4_ + auVar114._4_4_;
        auVar214._8_4_ = auVar114._8_4_ + auVar114._8_4_;
        auVar214._12_4_ = auVar114._12_4_ + auVar114._12_4_;
        auVar214._16_4_ = auVar114._16_4_ + auVar114._16_4_;
        auVar214._20_4_ = auVar114._20_4_ + auVar114._20_4_;
        auVar214._24_4_ = auVar114._24_4_ + auVar114._24_4_;
        auVar214._28_4_ = auVar114._28_4_ + auVar114._28_4_;
        auVar98 = vrcp14ps_avx512vl(auVar214);
        auVar96 = vfnmadd213ps_avx512vl(auVar214,auVar98,auVar143);
        auVar87 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
        auVar31._8_4_ = 0x80000000;
        auVar31._0_8_ = 0x8000000080000000;
        auVar31._12_4_ = 0x80000000;
        auVar31._16_4_ = 0x80000000;
        auVar31._20_4_ = 0x80000000;
        auVar31._24_4_ = 0x80000000;
        auVar31._28_4_ = 0x80000000;
        auVar98 = vxorps_avx512vl(auVar111,auVar31);
        auVar98 = vsubps_avx(auVar98,auVar97);
        auVar57._4_4_ = auVar98._4_4_ * auVar87._4_4_;
        auVar57._0_4_ = auVar98._0_4_ * auVar87._0_4_;
        auVar57._8_4_ = auVar98._8_4_ * auVar87._8_4_;
        auVar57._12_4_ = auVar98._12_4_ * auVar87._12_4_;
        auVar57._16_4_ = auVar98._16_4_ * 0.0;
        auVar57._20_4_ = auVar98._20_4_ * 0.0;
        auVar57._24_4_ = auVar98._24_4_ * 0.0;
        auVar57._28_4_ = 0x3e000000;
        auVar97 = vsubps_avx512vl(auVar97,auVar111);
        auVar58._4_4_ = auVar97._4_4_ * auVar87._4_4_;
        auVar58._0_4_ = auVar97._0_4_ * auVar87._0_4_;
        auVar58._8_4_ = auVar97._8_4_ * auVar87._8_4_;
        auVar58._12_4_ = auVar97._12_4_ * auVar87._12_4_;
        auVar58._16_4_ = auVar97._16_4_ * 0.0;
        auVar58._20_4_ = auVar97._20_4_ * 0.0;
        auVar58._24_4_ = auVar97._24_4_ * 0.0;
        auVar58._28_4_ = local_820._0_4_;
        auVar97 = vfmadd213ps_avx512vl(auVar113,auVar57,auVar107);
        auVar59._4_4_ = auVar99._4_4_ * auVar97._4_4_;
        auVar59._0_4_ = auVar99._0_4_ * auVar97._0_4_;
        auVar59._8_4_ = auVar99._8_4_ * auVar97._8_4_;
        auVar59._12_4_ = auVar99._12_4_ * auVar97._12_4_;
        auVar59._16_4_ = auVar99._16_4_ * auVar97._16_4_;
        auVar59._20_4_ = auVar99._20_4_ * auVar97._20_4_;
        auVar59._24_4_ = auVar99._24_4_ * auVar97._24_4_;
        auVar59._28_4_ = auVar98._28_4_;
        auVar97 = vmulps_avx512vl(local_520,auVar57);
        auVar96 = vmulps_avx512vl(local_540,auVar57);
        auVar69._4_4_ = uStack_55c;
        auVar69._0_4_ = local_560;
        auVar69._8_4_ = uStack_558;
        auVar69._12_4_ = uStack_554;
        auVar69._16_4_ = uStack_550;
        auVar69._20_4_ = uStack_54c;
        auVar69._24_4_ = uStack_548;
        auVar69._28_4_ = uStack_544;
        auVar109 = vmulps_avx512vl(auVar69,auVar57);
        auVar98 = vfmadd213ps_avx512vl(auVar100,auVar59,auVar192);
        auVar98 = vsubps_avx512vl(auVar97,auVar98);
        auVar97 = vfmadd213ps_avx512vl(auVar101,auVar59,auVar177);
        auVar110 = vsubps_avx512vl(auVar96,auVar97);
        auVar87 = vfmadd213ps_fma(auVar59,auVar102,auVar103);
        auVar97 = vsubps_avx(auVar109,ZEXT1632(auVar87));
        auVar234 = ZEXT3264(auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar113,auVar58,auVar107);
        auVar97 = vmulps_avx512vl(auVar99,auVar97);
        auVar99 = vmulps_avx512vl(local_520,auVar58);
        auVar107 = vmulps_avx512vl(local_540,auVar58);
        auVar96 = vmulps_avx512vl(auVar69,auVar58);
        auVar87 = vfmadd213ps_fma(auVar100,auVar97,auVar192);
        auVar109 = vsubps_avx(auVar99,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar101,auVar97,auVar177);
        auVar99 = vsubps_avx512vl(auVar107,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar102,auVar97,auVar103);
        auVar97 = vsubps_avx512vl(auVar96,ZEXT1632(auVar87));
        auVar206 = ZEXT3264(auVar97);
        auVar144._8_4_ = 0x7f800000;
        auVar144._0_8_ = 0x7f8000007f800000;
        auVar144._12_4_ = 0x7f800000;
        auVar144._16_4_ = 0x7f800000;
        auVar144._20_4_ = 0x7f800000;
        auVar144._24_4_ = 0x7f800000;
        auVar144._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar144,auVar57);
        bVar11 = (bool)((byte)uVar84 & 1);
        auVar125._0_4_ = (uint)bVar11 * auVar97._0_4_ | (uint)!bVar11 * auVar241._0_4_;
        bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar11 * auVar97._4_4_ | (uint)!bVar11 * auVar241._4_4_;
        bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar11 * auVar97._8_4_ | (uint)!bVar11 * auVar241._8_4_;
        bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar11 * auVar97._12_4_ | (uint)!bVar11 * auVar241._12_4_;
        iVar1 = (uint)((byte)(uVar84 >> 4) & 1) * auVar97._16_4_;
        auVar125._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar84 >> 5) & 1) * auVar97._20_4_;
        auVar125._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar84 >> 6) & 1) * auVar97._24_4_;
        auVar125._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar84 >> 7) * auVar97._28_4_;
        auVar125._28_4_ = iVar4;
        auVar145._8_4_ = 0xff800000;
        auVar145._0_8_ = 0xff800000ff800000;
        auVar145._12_4_ = 0xff800000;
        auVar145._16_4_ = 0xff800000;
        auVar145._20_4_ = 0xff800000;
        auVar145._24_4_ = 0xff800000;
        auVar145._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar145,auVar58);
        bVar11 = (bool)((byte)uVar84 & 1);
        auVar126._0_4_ = (uint)bVar11 * auVar97._0_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar11 * auVar97._4_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar11 * auVar97._8_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar11 * auVar97._12_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar11 * auVar97._16_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar11 * auVar97._20_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar11 * auVar97._24_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = SUB81(uVar84 >> 7,0);
        auVar126._28_4_ = (uint)bVar11 * auVar97._28_4_ | (uint)!bVar11 * -0x800000;
        auVar226._8_4_ = 0x7fffffff;
        auVar226._0_8_ = 0x7fffffff7fffffff;
        auVar226._12_4_ = 0x7fffffff;
        auVar226._16_4_ = 0x7fffffff;
        auVar226._20_4_ = 0x7fffffff;
        auVar226._24_4_ = 0x7fffffff;
        auVar226._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(auVar226,local_640);
        auVar97 = vmaxps_avx(local_480,auVar97);
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(auVar97,auVar32);
        auVar100 = vandps_avx(auVar114,auVar226);
        uVar81 = vcmpps_avx512vl(auVar100,auVar97,1);
        uVar84 = uVar84 & uVar81;
        bVar78 = (byte)uVar84;
        if (bVar78 != 0) {
          uVar81 = vcmpps_avx512vl(auVar108,ZEXT1632(auVar88),2);
          auVar227._8_4_ = 0xff800000;
          auVar227._0_8_ = 0xff800000ff800000;
          auVar227._12_4_ = 0xff800000;
          auVar227._16_4_ = 0xff800000;
          auVar227._20_4_ = 0xff800000;
          auVar227._24_4_ = 0xff800000;
          auVar227._28_4_ = 0xff800000;
          auVar244._8_4_ = 0x7f800000;
          auVar244._0_8_ = 0x7f8000007f800000;
          auVar244._12_4_ = 0x7f800000;
          auVar244._16_4_ = 0x7f800000;
          auVar244._20_4_ = 0x7f800000;
          auVar244._24_4_ = 0x7f800000;
          auVar244._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar244,auVar227);
          bVar77 = (byte)uVar81;
          uVar85 = (uint)(bVar77 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar97._0_4_;
          bVar11 = (bool)((byte)(uVar81 >> 1) & 1);
          uVar128 = (uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar97._4_4_;
          bVar11 = (bool)((byte)(uVar81 >> 2) & 1);
          uVar129 = (uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar97._8_4_;
          bVar11 = (bool)((byte)(uVar81 >> 3) & 1);
          uVar130 = (uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar97._12_4_;
          bVar11 = (bool)((byte)(uVar81 >> 4) & 1);
          uVar131 = (uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * auVar97._16_4_;
          bVar11 = (bool)((byte)(uVar81 >> 5) & 1);
          uVar132 = (uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * auVar97._20_4_;
          bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
          uVar133 = (uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * auVar97._24_4_;
          bVar11 = SUB81(uVar81 >> 7,0);
          uVar134 = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar97._28_4_;
          auVar125._0_4_ = (bVar78 & 1) * uVar85 | !(bool)(bVar78 & 1) * auVar125._0_4_;
          bVar11 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar125._4_4_ = bVar11 * uVar128 | !bVar11 * auVar125._4_4_;
          bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar125._8_4_ = bVar11 * uVar129 | !bVar11 * auVar125._8_4_;
          bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar125._12_4_ = bVar11 * uVar130 | !bVar11 * auVar125._12_4_;
          bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar125._16_4_ = bVar11 * uVar131 | (uint)!bVar11 * iVar1;
          bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar125._20_4_ = bVar11 * uVar132 | (uint)!bVar11 * iVar2;
          bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar125._24_4_ = bVar11 * uVar133 | (uint)!bVar11 * iVar3;
          bVar11 = SUB81(uVar84 >> 7,0);
          auVar125._28_4_ = bVar11 * uVar134 | (uint)!bVar11 * iVar4;
          auVar100 = vblendmps_avx512vl(auVar227,auVar244);
          bVar11 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar81 >> 4) & 1);
          bVar15 = (bool)((byte)(uVar81 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
          bVar17 = SUB81(uVar81 >> 7,0);
          auVar97._0_4_ =
               (uint)(bVar78 & 1) *
               ((uint)(bVar77 & 1) * auVar100._0_4_ | !(bool)(bVar77 & 1) * uVar85) |
               !(bool)(bVar78 & 1) * auVar126._0_4_;
          bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar97._4_4_ =
               (uint)bVar83 * ((uint)bVar11 * auVar100._4_4_ | !bVar11 * uVar128) |
               !bVar83 * auVar126._4_4_;
          bVar11 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar97._8_4_ =
               (uint)bVar11 * ((uint)bVar12 * auVar100._8_4_ | !bVar12 * uVar129) |
               !bVar11 * auVar126._8_4_;
          bVar11 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar97._12_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar100._12_4_ | !bVar13 * uVar130) |
               !bVar11 * auVar126._12_4_;
          bVar11 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar97._16_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar100._16_4_ | !bVar14 * uVar131) |
               !bVar11 * auVar126._16_4_;
          bVar11 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar97._20_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar100._20_4_ | !bVar15 * uVar132) |
               !bVar11 * auVar126._20_4_;
          bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar97._24_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar100._24_4_ | !bVar16 * uVar133) |
               !bVar11 * auVar126._24_4_;
          bVar11 = SUB81(uVar84 >> 7,0);
          auVar97._28_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar100._28_4_ | !bVar17 * uVar134) |
               !bVar11 * auVar126._28_4_;
          bVar80 = (~bVar78 | bVar77) & bVar80;
          auVar126 = auVar97;
        }
      }
      auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar248._8_4_ = 0x7fffffff;
      auVar248._0_8_ = 0x7fffffff7fffffff;
      auVar248._12_4_ = 0x7fffffff;
      auVar250 = ZEXT1664(auVar248);
      uVar229 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar224._4_4_ = uVar229;
      auVar224._0_4_ = uVar229;
      auVar224._8_4_ = uVar229;
      auVar224._12_4_ = uVar229;
      auVar224._16_4_ = uVar229;
      auVar224._20_4_ = uVar229;
      auVar224._24_4_ = uVar229;
      auVar224._28_4_ = uVar229;
      uVar229 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar228._4_4_ = uVar229;
      auVar228._0_4_ = uVar229;
      auVar228._8_4_ = uVar229;
      auVar228._12_4_ = uVar229;
      auVar228._16_4_ = uVar229;
      auVar228._20_4_ = uVar229;
      auVar228._24_4_ = uVar229;
      auVar228._28_4_ = uVar229;
      fVar233 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar220._0_4_ = fVar233 * auVar206._0_4_;
      auVar220._4_4_ = fVar233 * auVar206._4_4_;
      auVar220._8_4_ = fVar233 * auVar206._8_4_;
      auVar220._12_4_ = fVar233 * auVar206._12_4_;
      auVar220._16_4_ = fVar233 * auVar206._16_4_;
      auVar220._20_4_ = fVar233 * auVar206._20_4_;
      auVar220._28_36_ = auVar206._28_36_;
      auVar220._24_4_ = fVar233 * auVar206._24_4_;
      auVar87 = vfmadd231ps_fma(auVar220._0_32_,auVar228,auVar99);
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar224,auVar109);
      _local_460 = _local_5a0;
      local_440 = vminps_avx(local_400,auVar125);
      auVar242._8_4_ = 0x7fffffff;
      auVar242._0_8_ = 0x7fffffff7fffffff;
      auVar242._12_4_ = 0x7fffffff;
      auVar242._16_4_ = 0x7fffffff;
      auVar242._20_4_ = 0x7fffffff;
      auVar242._24_4_ = 0x7fffffff;
      auVar242._28_4_ = 0x7fffffff;
      auVar243 = ZEXT3264(auVar242);
      auVar99 = vandps_avx(auVar242,ZEXT1632(auVar87));
      _local_420 = vmaxps_avx(_local_5a0,auVar126);
      auVar220 = ZEXT3264(_local_420);
      auVar147._8_4_ = 0x3e99999a;
      auVar147._0_8_ = 0x3e99999a3e99999a;
      auVar147._12_4_ = 0x3e99999a;
      auVar147._16_4_ = 0x3e99999a;
      auVar147._20_4_ = 0x3e99999a;
      auVar147._24_4_ = 0x3e99999a;
      auVar147._28_4_ = 0x3e99999a;
      uVar20 = vcmpps_avx512vl(auVar99,auVar147,1);
      local_784 = (int)uVar20;
      uVar20 = vcmpps_avx512vl(_local_5a0,local_440,2);
      bVar78 = (byte)uVar20 & bVar76;
      _local_580 = _local_420;
      uVar21 = vcmpps_avx512vl(_local_420,local_400,2);
      if ((bVar76 & ((byte)uVar21 | (byte)uVar20)) == 0) {
        auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
      else {
        auVar60._4_4_ = auVar234._4_4_ * fVar233;
        auVar60._0_4_ = auVar234._0_4_ * fVar233;
        auVar60._8_4_ = auVar234._8_4_ * fVar233;
        auVar60._12_4_ = auVar234._12_4_ * fVar233;
        auVar60._16_4_ = auVar234._16_4_ * fVar233;
        auVar60._20_4_ = auVar234._20_4_ * fVar233;
        auVar60._24_4_ = auVar234._24_4_ * fVar233;
        auVar60._28_4_ = 0x3e99999a;
        auVar87 = vfmadd213ps_fma(auVar110,auVar228,auVar60);
        auVar87 = vfmadd213ps_fma(auVar98,auVar224,ZEXT1632(auVar87));
        auVar97 = vandps_avx(auVar242,ZEXT1632(auVar87));
        uVar20 = vcmpps_avx512vl(auVar97,auVar147,1);
        local_78c = (uint)(byte)~bVar80;
        bVar80 = (byte)uVar20 | ~bVar80;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar148,auVar33);
        local_3e0._0_4_ = (uint)(bVar80 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar11 = (bool)(bVar80 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar11 * auVar97._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar11 * auVar97._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar11 * auVar97._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar11 * auVar97._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar11 * auVar97._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar11 * auVar97._24_4_ | (uint)!bVar11 * 2;
        local_3e0._28_4_ = (uint)(bVar80 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar20 = vpcmpd_avx512vl(local_4a0,local_3e0,5);
        local_788 = (uint)bVar78;
        bVar78 = (byte)uVar20 & bVar78;
        if (bVar78 != 0) {
          auVar241 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar87 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar7 = vminps_avx(auVar241,auVar88);
          auVar241 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar88 = vmaxps_avx(auVar87,auVar241);
          auVar87 = vandps_avx(auVar248,auVar7);
          auVar241 = vandps_avx(auVar248,auVar88);
          auVar87 = vmaxps_avx(auVar87,auVar241);
          auVar241 = vmovshdup_avx(auVar87);
          auVar241 = vmaxss_avx(auVar241,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar241);
          fVar233 = auVar87._0_4_ * 1.9073486e-06;
          local_620 = vshufps_avx(auVar88,auVar88,0xff);
          local_500 = (float)local_5a0._0_4_ + (float)local_660._0_4_;
          fStack_4fc = (float)local_5a0._4_4_ + (float)local_660._4_4_;
          fStack_4f8 = fStack_598 + fStack_658;
          fStack_4f4 = fStack_594 + fStack_654;
          fStack_4f0 = fStack_590 + fStack_650;
          fStack_4ec = fStack_58c + fStack_64c;
          fStack_4e8 = fStack_588 + fStack_648;
          fStack_4e4 = fStack_584 + fStack_644;
          _local_5a0 = auVar104;
          do {
            auVar100 = local_820;
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar149,_local_5a0);
            auVar127._0_4_ =
                 (uint)(bVar78 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar11 * auVar97._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar11 * auVar97._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar11 * auVar97._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar11 * auVar97._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar11 * auVar97._20_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar78 >> 6 & 1);
            auVar127._24_4_ = (uint)bVar11 * auVar97._24_4_ | (uint)!bVar11 * 0x7f800000;
            auVar127._28_4_ =
                 (uint)(bVar78 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
            auVar97 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar97 = vminps_avx(auVar127,auVar97);
            auVar99 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar99);
            auVar99 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar99);
            uVar20 = vcmpps_avx512vl(auVar127,auVar97,0);
            bVar77 = (byte)uVar20 & bVar78;
            bVar80 = bVar78;
            if (bVar77 != 0) {
              bVar80 = bVar77;
            }
            iVar1 = 0;
            for (uVar85 = (uint)bVar80; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            auVar243 = ZEXT464(*(uint *)(local_4c0 + (uint)(iVar1 << 2)));
            auVar232 = ZEXT464(*(uint *)(local_460 + (uint)(iVar1 << 2)));
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            local_640._0_16_ = (undefined1  [16])aVar5;
            auVar87 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar87._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_4c0 + (uint)(iVar1 << 2)));
              local_840._0_16_ = ZEXT416(*(uint *)(local_460 + (uint)(iVar1 << 2)));
              local_820[1] = 0;
              local_820[0] = bVar78;
              local_820._2_30_ = auVar100._2_30_;
              fVar135 = sqrtf(auVar87._0_4_);
              bVar78 = local_820[0];
              auVar232 = ZEXT1664(local_840._0_16_);
              auVar243 = ZEXT1664(local_880._0_16_);
              auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar87 = vsqrtss_avx(auVar87,auVar87);
              fVar135 = auVar87._0_4_;
            }
            lVar82 = 4;
            do {
              local_840._0_16_ = auVar232._0_16_;
              uVar229 = auVar232._0_4_;
              auVar137._4_4_ = uVar229;
              auVar137._0_4_ = uVar229;
              auVar137._8_4_ = uVar229;
              auVar137._12_4_ = uVar229;
              auVar89 = auVar247._0_16_;
              auVar87 = vfmadd132ps_fma(auVar137,auVar89,local_640._0_16_);
              fVar239 = auVar243._0_4_;
              fVar238 = 1.0 - fVar239;
              fVar237 = fVar238 * fVar238 * fVar238;
              fVar235 = fVar239 * fVar239;
              fVar158 = fVar239 * fVar235;
              auVar241 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar237),
                                         ZEXT416((uint)fVar158));
              fVar236 = fVar239 * fVar238;
              local_820._0_16_ = ZEXT416((uint)fVar238);
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar236 * 6.0)),
                                       ZEXT416((uint)(fVar236 * fVar238)),
                                       SUB6416(ZEXT464(0x41400000),0));
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar158),
                                        ZEXT416((uint)fVar237));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar238 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar239 * fVar236)));
              fVar237 = fVar237 * 0.16666667;
              fVar238 = (auVar241._0_4_ + auVar7._0_4_) * 0.16666667;
              fVar239 = (auVar88._0_4_ + auVar86._0_4_) * 0.16666667;
              fVar158 = fVar158 * 0.16666667;
              auVar181._0_4_ = fVar158 * (float)local_6e0._0_4_;
              auVar181._4_4_ = fVar158 * (float)local_6e0._4_4_;
              auVar181._8_4_ = fVar158 * fStack_6d8;
              auVar181._12_4_ = fVar158 * fStack_6d4;
              auVar207._4_4_ = fVar239;
              auVar207._0_4_ = fVar239;
              auVar207._8_4_ = fVar239;
              auVar207._12_4_ = fVar239;
              auVar241 = vfmadd132ps_fma(auVar207,auVar181,local_6a0._0_16_);
              auVar182._4_4_ = fVar238;
              auVar182._0_4_ = fVar238;
              auVar182._8_4_ = fVar238;
              auVar182._12_4_ = fVar238;
              auVar241 = vfmadd132ps_fma(auVar182,auVar241,local_6c0._0_16_);
              auVar160._4_4_ = fVar237;
              auVar160._0_4_ = fVar237;
              auVar160._8_4_ = fVar237;
              auVar160._12_4_ = fVar237;
              local_5b0 = vfmadd132ps_fma(auVar160,auVar241,local_680._0_16_);
              auVar87 = vsubps_avx(auVar87,local_5b0);
              local_700._0_16_ = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_880._0_16_ = auVar243._0_16_;
              local_720._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_860._0_4_ = fVar235;
                auVar250._0_4_ = sqrtf(auVar87._0_4_);
                auVar250._4_60_ = extraout_var;
                auVar89 = ZEXT816(0) << 0x40;
                auVar87 = auVar250._0_16_;
                auVar241 = local_880._0_16_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_860._0_4_ = fVar235;
                auVar241 = auVar243._0_16_;
              }
              local_5c0 = local_820._0_4_;
              fStack_5bc = local_5c0;
              fStack_5b8 = local_5c0;
              fStack_5b4 = local_5c0;
              auVar88 = vfnmsub213ss_fma(auVar241,auVar241,ZEXT416((uint)(fVar236 * 4.0)));
              auVar241 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * 4.0)),local_820._0_16_,
                                         local_820._0_16_);
              fVar235 = local_5c0 * -local_5c0 * 0.5;
              fVar236 = auVar88._0_4_ * 0.5;
              fVar237 = auVar241._0_4_ * 0.5;
              local_860._0_4_ = (float)local_860._0_4_ * 0.5;
              auVar199._0_4_ = (float)local_860._0_4_ * (float)local_6e0._0_4_;
              auVar199._4_4_ = (float)local_860._0_4_ * (float)local_6e0._4_4_;
              auVar199._8_4_ = (float)local_860._0_4_ * fStack_6d8;
              auVar199._12_4_ = (float)local_860._0_4_ * fStack_6d4;
              auVar161._4_4_ = fVar237;
              auVar161._0_4_ = fVar237;
              auVar161._8_4_ = fVar237;
              auVar161._12_4_ = fVar237;
              auVar241 = vfmadd132ps_fma(auVar161,auVar199,local_6a0._0_16_);
              auVar183._4_4_ = fVar236;
              auVar183._0_4_ = fVar236;
              auVar183._8_4_ = fVar236;
              auVar183._12_4_ = fVar236;
              auVar241 = vfmadd132ps_fma(auVar183,auVar241,local_6c0._0_16_);
              auVar251._4_4_ = fVar235;
              auVar251._0_4_ = fVar235;
              auVar251._8_4_ = fVar235;
              auVar251._12_4_ = fVar235;
              local_860 = vfmadd132ps_fma(auVar251,auVar241,local_680._0_16_);
              local_5d0 = vdpps_avx(local_860,local_860,0x7f);
              fVar236 = local_5d0._0_4_;
              auVar162._4_12_ = auVar89._4_12_;
              auVar162._0_4_ = fVar236;
              local_7e0 = vrsqrt14ss_avx512f(auVar89,auVar162);
              fVar235 = local_7e0._0_4_ * 1.5;
              local_5e0 = vrcp14ss_avx512f(auVar89,auVar162);
              auVar241 = vfnmadd213ss_fma(local_5e0,local_5d0,ZEXT416(0x40000000));
              uVar85 = auVar87._0_4_;
              if (fVar236 < -fVar236) {
                local_7f0._0_4_ = fVar235;
                auVar247._0_4_ = sqrtf(fVar236);
                auVar247._4_60_ = extraout_var_00;
                auVar87 = ZEXT416(uVar85);
                auVar89 = ZEXT816(0) << 0x40;
                auVar88 = auVar247._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx512f(local_5d0,local_5d0);
                local_7f0._0_4_ = fVar235;
              }
              fVar235 = local_7e0._0_4_;
              fVar235 = (float)local_7f0._0_4_ + fVar236 * -0.5 * fVar235 * fVar235 * fVar235;
              local_7f0._0_4_ = local_860._0_4_ * fVar235;
              local_7f0._4_4_ = local_860._4_4_ * fVar235;
              local_7f0._8_4_ = local_860._8_4_ * fVar235;
              local_7f0._12_4_ = local_860._12_4_ * fVar235;
              local_7e0 = vdpps_avx(local_700._0_16_,local_7f0,0x7f);
              fVar237 = auVar87._0_4_;
              auVar138._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar138._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar138._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar138._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar7 = vsubps_avx(local_720._0_16_,auVar138);
              fVar236 = auVar7._0_4_;
              auVar163._4_12_ = auVar89._4_12_;
              auVar163._0_4_ = fVar236;
              auVar86 = vrsqrt14ss_avx512f(auVar89,auVar163);
              auVar89 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
              auVar90 = vmulss_avx512f(auVar7,ZEXT416(0xbf000000));
              if (fVar236 < 0.0) {
                local_600 = fVar235;
                fStack_5fc = fVar235;
                fStack_5f8 = fVar235;
                fStack_5f4 = fVar235;
                local_5f0 = auVar86;
                fVar236 = sqrtf(fVar236);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar87 = ZEXT416(uVar85);
                auVar86 = local_5f0;
                fVar235 = local_600;
                fVar238 = fStack_5fc;
                fVar239 = fStack_5f8;
                fVar158 = fStack_5f4;
              }
              else {
                auVar7 = vsqrtss_avx(auVar7,auVar7);
                fVar236 = auVar7._0_4_;
                fVar238 = fVar235;
                fVar239 = fVar235;
                fVar158 = fVar235;
              }
              auVar234 = ZEXT1664(local_700._0_16_);
              auVar249._8_4_ = 0x7fffffff;
              auVar249._0_8_ = 0x7fffffff7fffffff;
              auVar249._12_4_ = 0x7fffffff;
              auVar250 = ZEXT1664(auVar249);
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,
                                        local_880._0_16_);
              auVar7 = vfmadd231ss_fma(local_820._0_16_,local_880._0_16_,
                                       SUB6416(ZEXT464(0xc0000000),0));
              fVar240 = local_880._0_4_;
              auVar184._0_4_ = fVar240 * (float)local_6e0._0_4_;
              auVar184._4_4_ = fVar240 * (float)local_6e0._4_4_;
              auVar184._8_4_ = fVar240 * fStack_6d8;
              auVar184._12_4_ = fVar240 * fStack_6d4;
              auVar200._0_4_ = auVar7._0_4_;
              auVar200._4_4_ = auVar200._0_4_;
              auVar200._8_4_ = auVar200._0_4_;
              auVar200._12_4_ = auVar200._0_4_;
              auVar7 = vfmadd132ps_fma(auVar200,auVar184,local_6a0._0_16_);
              auVar164._0_4_ = auVar92._0_4_;
              auVar164._4_4_ = auVar164._0_4_;
              auVar164._8_4_ = auVar164._0_4_;
              auVar164._12_4_ = auVar164._0_4_;
              auVar7 = vfmadd132ps_fma(auVar164,auVar7,local_6c0._0_16_);
              auVar65._4_4_ = fStack_5bc;
              auVar65._0_4_ = local_5c0;
              auVar65._8_4_ = fStack_5b8;
              auVar65._12_4_ = fStack_5b4;
              auVar7 = vfmadd132ps_fma(auVar65,auVar7,local_680._0_16_);
              auVar165._0_4_ = auVar7._0_4_ * (float)local_5d0._0_4_;
              auVar165._4_4_ = auVar7._4_4_ * (float)local_5d0._0_4_;
              auVar165._8_4_ = auVar7._8_4_ * (float)local_5d0._0_4_;
              auVar165._12_4_ = auVar7._12_4_ * (float)local_5d0._0_4_;
              auVar7 = vdpps_avx(local_860,auVar7,0x7f);
              fVar198 = auVar7._0_4_;
              auVar185._0_4_ = local_860._0_4_ * fVar198;
              auVar185._4_4_ = local_860._4_4_ * fVar198;
              auVar185._8_4_ = local_860._8_4_ * fVar198;
              auVar185._12_4_ = local_860._12_4_ * fVar198;
              auVar7 = vsubps_avx(auVar165,auVar185);
              fVar198 = auVar241._0_4_ * (float)local_5e0._0_4_;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar91 = vxorps_avx512vl(local_860,auVar23);
              auVar208._0_4_ = fVar235 * auVar7._0_4_ * fVar198;
              auVar208._4_4_ = fVar238 * auVar7._4_4_ * fVar198;
              auVar208._8_4_ = fVar239 * auVar7._8_4_ * fVar198;
              auVar208._12_4_ = fVar158 * auVar7._12_4_ * fVar198;
              auVar241 = vdpps_avx(auVar91,local_7f0,0x7f);
              auVar7 = vmaxss_avx(ZEXT416((uint)fVar233),
                                  ZEXT416((uint)((float)local_840._0_4_ * fVar135 * 1.9073486e-06)))
              ;
              auVar92 = vdivss_avx512f(ZEXT416((uint)fVar233),auVar88);
              auVar88 = vdpps_avx(local_700._0_16_,auVar208,0x7f);
              auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar233),auVar7);
              auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),auVar92,auVar87);
              auVar87 = vdpps_avx(local_640._0_16_,local_7f0,0x7f);
              fVar235 = auVar241._0_4_ + auVar88._0_4_;
              auVar241 = vdpps_avx(local_700._0_16_,auVar91,0x7f);
              auVar90 = vmulss_avx512f(auVar90,auVar86);
              auVar86 = vmulss_avx512f(auVar86,auVar86);
              auVar88 = vdpps_avx(local_700._0_16_,local_640._0_16_,0x7f);
              auVar86 = vaddss_avx512f(auVar89,ZEXT416((uint)(auVar90._0_4_ * auVar86._0_4_)));
              auVar89 = vfnmadd231ss_avx512f(auVar241,local_7e0,ZEXT416((uint)fVar235));
              auVar90 = vfnmadd231ss_avx512f(auVar88,local_7e0,auVar87);
              auVar241 = vpermilps_avx(local_5b0,0xff);
              fVar236 = fVar236 - auVar241._0_4_;
              auVar241 = vshufps_avx(local_860,local_860,0xff);
              auVar88 = vfmsub213ss_fma(auVar89,auVar86,auVar241);
              fVar237 = auVar90._0_4_ * auVar86._0_4_;
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar235),ZEXT416((uint)fVar237));
              fVar238 = auVar86._0_4_;
              auVar221._0_4_ = fVar237 / fVar238;
              auVar221._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar218._0_4_ = auVar88._0_4_ / fVar238;
              auVar218._4_12_ = auVar88._4_12_;
              auVar88 = vmulss_avx512f(local_7e0,auVar221);
              auVar86 = vmulss_avx512f(local_7e0,auVar218);
              auVar220 = ZEXT1664(auVar86);
              fVar240 = fVar240 - (auVar88._0_4_ - fVar236 * (auVar87._0_4_ / fVar238));
              auVar243 = ZEXT464((uint)fVar240);
              fVar235 = (float)local_840._0_4_ - (fVar236 * (fVar235 / fVar238) - auVar86._0_4_);
              auVar232 = ZEXT464((uint)fVar235);
              auVar87 = vandps_avx512vl(local_7e0,auVar249);
              if (auVar92._0_4_ <= auVar87._0_4_) {
                bVar11 = false;
                auVar247 = ZEXT864(0) << 0x20;
              }
              else {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar7._0_4_)),local_620,
                                          ZEXT416(0x36000000));
                auVar87 = vandps_avx(auVar249,ZEXT416((uint)fVar236));
                auVar62._12_4_ = 0;
                auVar62._0_12_ = ZEXT812(0);
                auVar247 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar88._0_4_ <= auVar87._0_4_) {
                  bVar11 = false;
                }
                else {
                  fVar235 = fVar235 + (float)local_610._0_4_;
                  auVar232 = ZEXT464((uint)fVar235);
                  bVar11 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar235) &&
                       (fVar236 = (ray->super_RayK<1>).tfar, fVar235 <= fVar236)) &&
                      (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                    auVar87 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)local_720._0_4_));
                    fVar237 = auVar87._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_888].ptr;
                    if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar237 = fVar237 * 1.5 + local_720._0_4_ * -0.5 * fVar237 * fVar237 * fVar237
                      ;
                      auVar166._0_4_ = local_700._0_4_ * fVar237;
                      auVar166._4_4_ = local_700._4_4_ * fVar237;
                      auVar166._8_4_ = local_700._8_4_ * fVar237;
                      auVar166._12_4_ = local_700._12_4_ * fVar237;
                      auVar7 = vfmadd213ps_fma(auVar241,auVar166,local_860);
                      auVar87 = vshufps_avx(auVar166,auVar166,0xc9);
                      auVar241 = vshufps_avx(local_860,local_860,0xc9);
                      auVar167._0_4_ = auVar166._0_4_ * auVar241._0_4_;
                      auVar167._4_4_ = auVar166._4_4_ * auVar241._4_4_;
                      auVar167._8_4_ = auVar166._8_4_ * auVar241._8_4_;
                      auVar167._12_4_ = auVar166._12_4_ * auVar241._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar167,local_860,auVar87);
                      auVar87 = vshufps_avx(auVar88,auVar88,0xc9);
                      auVar241 = vshufps_avx(auVar7,auVar7,0xc9);
                      auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                      auVar139._0_4_ = auVar7._0_4_ * auVar88._0_4_;
                      auVar139._4_4_ = auVar7._4_4_ * auVar88._4_4_;
                      auVar139._8_4_ = auVar7._8_4_ * auVar88._8_4_;
                      auVar139._12_4_ = auVar7._12_4_ * auVar88._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar139,auVar87,auVar241);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar235;
                        auVar241 = vshufps_avx(auVar87,auVar87,0xe9);
                        uVar20 = vmovlps_avx(auVar241);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                        (ray->Ng).field_0.field_0.z = auVar87._0_4_;
                        ray->u = fVar240;
                        ray->v = 0.0;
                        ray->primID = (uint)local_848;
                        ray->geomID = (uint)local_888;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar241 = vshufps_avx(auVar87,auVar87,0xe9);
                        local_770 = vmovlps_avx(auVar241);
                        local_768 = auVar87._0_4_;
                        local_764 = fVar240;
                        local_760 = 0;
                        local_75c = (uint)local_848;
                        local_758 = (uint)local_888;
                        local_754 = context->user->instID[0];
                        local_750 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar235;
                        local_88c = -1;
                        local_7c0.valid = &local_88c;
                        local_7c0.geometryUserPtr = pGVar9->userPtr;
                        local_7c0.context = context->user;
                        local_7c0.ray = (RTCRayN *)ray;
                        local_7c0.hit = (RTCHitN *)&local_770;
                        local_7c0.N = 1;
                        local_880._0_16_ = ZEXT416((uint)fVar240);
                        local_840._0_16_ = ZEXT416((uint)fVar235);
                        local_820._0_4_ = fVar236;
                        if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01e0484a:
                          p_Var10 = context->args->filter;
                          if (p_Var10 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              auVar220 = ZEXT1664(auVar220._0_16_);
                              auVar234 = ZEXT1664(auVar234._0_16_);
                              (*p_Var10)(&local_7c0);
                              auVar232 = ZEXT1664(local_840._0_16_);
                              auVar243 = ZEXT1664(local_880._0_16_);
                              auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
                              fVar236 = (float)local_820._0_4_;
                            }
                            if (*local_7c0.valid == 0) goto LAB_01e04903;
                          }
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).components[0] =
                               *(float *)local_7c0.hit;
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_7c0.hit + 4);
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_7c0.hit + 8);
                          *(float *)((long)local_7c0.ray + 0x3c) = *(float *)(local_7c0.hit + 0xc);
                          *(float *)((long)local_7c0.ray + 0x40) = *(float *)(local_7c0.hit + 0x10);
                          *(float *)((long)local_7c0.ray + 0x44) = *(float *)(local_7c0.hit + 0x14);
                          *(float *)((long)local_7c0.ray + 0x48) = *(float *)(local_7c0.hit + 0x18);
                          *(float *)((long)local_7c0.ray + 0x4c) = *(float *)(local_7c0.hit + 0x1c);
                          *(float *)((long)local_7c0.ray + 0x50) = *(float *)(local_7c0.hit + 0x20);
                        }
                        else {
                          auVar220 = ZEXT1664(auVar86);
                          auVar234 = ZEXT1664(local_700._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_7c0);
                          auVar232 = ZEXT1664(local_840._0_16_);
                          auVar243 = ZEXT1664(local_880._0_16_);
                          auVar250 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar236 = (float)local_820._0_4_;
                          if (*local_7c0.valid != 0) goto LAB_01e0484a;
LAB_01e04903:
                          (ray->super_RayK<1>).tfar = fVar236;
                        }
                      }
                    }
                  }
                }
              }
              bVar83 = lVar82 != 0;
              lVar82 = lVar82 + -1;
            } while ((!bVar11) && (bVar83));
            auVar70._4_4_ = fStack_4fc;
            auVar70._0_4_ = local_500;
            auVar70._8_4_ = fStack_4f8;
            auVar70._12_4_ = fStack_4f4;
            auVar70._16_4_ = fStack_4f0;
            auVar70._20_4_ = fStack_4ec;
            auVar70._24_4_ = fStack_4e8;
            auVar70._28_4_ = fStack_4e4;
            fVar135 = (ray->super_RayK<1>).tfar;
            auVar34._4_4_ = fVar135;
            auVar34._0_4_ = fVar135;
            auVar34._8_4_ = fVar135;
            auVar34._12_4_ = fVar135;
            auVar34._16_4_ = fVar135;
            auVar34._20_4_ = fVar135;
            auVar34._24_4_ = fVar135;
            auVar34._28_4_ = fVar135;
            uVar20 = vcmpps_avx512vl(auVar70,auVar34,2);
            bVar78 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar78 & (byte)uVar20;
          } while (bVar78 != 0);
        }
        auVar150._0_4_ = (float)local_580._0_4_ + (float)local_660._0_4_;
        auVar150._4_4_ = (float)local_580._4_4_ + (float)local_660._4_4_;
        auVar150._8_4_ = fStack_578 + fStack_658;
        auVar150._12_4_ = fStack_574 + fStack_654;
        auVar150._16_4_ = fStack_570 + fStack_650;
        auVar150._20_4_ = fStack_56c + fStack_64c;
        auVar150._24_4_ = fStack_568 + fStack_648;
        auVar150._28_4_ = fStack_564 + fStack_644;
        fVar233 = (ray->super_RayK<1>).tfar;
        auVar35._4_4_ = fVar233;
        auVar35._0_4_ = fVar233;
        auVar35._8_4_ = fVar233;
        auVar35._12_4_ = fVar233;
        auVar35._16_4_ = fVar233;
        auVar35._20_4_ = fVar233;
        auVar35._24_4_ = fVar233;
        auVar35._28_4_ = fVar233;
        uVar20 = vcmpps_avx512vl(auVar150,auVar35,2);
        bVar80 = (byte)local_784 | (byte)local_78c;
        bVar76 = (byte)uVar21 & bVar76 & (byte)uVar20;
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar151,auVar36);
        auVar97._0_4_ = (uint)(bVar80 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar11 = (bool)(bVar80 >> 1 & 1);
        auVar97._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 2 & 1);
        auVar97._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 3 & 1);
        auVar97._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 4 & 1);
        auVar97._16_4_ = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 5 & 1);
        auVar97._20_4_ = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar80 >> 6 & 1);
        auVar97._24_4_ = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * 2;
        auVar97._28_4_ = (uint)(bVar80 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        _local_580 = auVar97;
        uVar20 = vpcmpd_avx512vl(auVar97,local_4a0,2);
        bVar80 = (byte)uVar20 & bVar76;
        if (bVar80 != 0) {
          auVar241 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar87 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar88 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar7 = vminps_avx(auVar241,auVar88);
          auVar241 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar88 = vmaxps_avx(auVar87,auVar241);
          auVar87 = vandps_avx(auVar250._0_16_,auVar7);
          auVar241 = vandps_avx(auVar250._0_16_,auVar88);
          auVar87 = vmaxps_avx(auVar87,auVar241);
          auVar241 = vmovshdup_avx(auVar87);
          auVar241 = vmaxss_avx(auVar241,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar241);
          fVar233 = auVar87._0_4_ * 1.9073486e-06;
          local_620 = vshufps_avx(auVar88,auVar88,0xff);
          _local_5a0 = _local_420;
          local_500 = (float)local_420._0_4_ + (float)local_660._0_4_;
          fStack_4fc = (float)local_420._4_4_ + (float)local_660._4_4_;
          fStack_4f8 = fStack_418 + fStack_658;
          fStack_4f4 = fStack_414 + fStack_654;
          fStack_4f0 = fStack_410 + fStack_650;
          fStack_4ec = fStack_40c + fStack_64c;
          fStack_4e8 = fStack_408 + fStack_648;
          fStack_4e4 = fStack_404 + fStack_644;
          do {
            auVar101 = local_820;
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar152,_local_5a0);
            auVar97._0_4_ =
                 (uint)(bVar80 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 1 & 1);
            auVar97._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 2 & 1);
            auVar97._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 3 & 1);
            auVar97._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 4 & 1);
            auVar97._16_4_ = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 5 & 1);
            auVar97._20_4_ = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar80 >> 6 & 1);
            auVar97._24_4_ = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * 0x7f800000;
            auVar97._28_4_ =
                 (uint)(bVar80 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
            auVar99 = vshufps_avx(auVar97,auVar97,0xb1);
            auVar99 = vminps_avx(auVar97,auVar99);
            auVar100 = vshufpd_avx(auVar99,auVar99,5);
            auVar99 = vminps_avx(auVar99,auVar100);
            auVar100 = vpermpd_avx2(auVar99,0x4e);
            auVar99 = vminps_avx(auVar99,auVar100);
            uVar20 = vcmpps_avx512vl(auVar97,auVar99,0);
            bVar77 = (byte)uVar20 & bVar80;
            bVar78 = bVar80;
            if (bVar77 != 0) {
              bVar78 = bVar77;
            }
            iVar1 = 0;
            for (uVar85 = (uint)bVar78; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            auVar243 = ZEXT464(*(uint *)(local_4e0 + (uint)(iVar1 << 2)));
            auVar234 = ZEXT464(*(uint *)(local_400 + (uint)(iVar1 << 2)));
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            local_640._0_16_ = (undefined1  [16])aVar5;
            auVar87 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar87._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar1 << 2)));
              local_840._0_16_ = ZEXT416(*(uint *)(local_400 + (uint)(iVar1 << 2)));
              local_820[1] = 0;
              local_820[0] = bVar80;
              local_820._2_30_ = auVar101._2_30_;
              fVar135 = sqrtf(auVar87._0_4_);
              bVar80 = local_820[0];
              auVar234 = ZEXT1664(local_840._0_16_);
              auVar243 = ZEXT1664(local_880._0_16_);
              auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar87 = vsqrtss_avx(auVar87,auVar87);
              fVar135 = auVar87._0_4_;
            }
            lVar82 = 4;
            do {
              auVar89 = auVar97._16_16_;
              local_840._0_16_ = auVar234._0_16_;
              uVar229 = auVar234._0_4_;
              auVar140._4_4_ = uVar229;
              auVar140._0_4_ = uVar229;
              auVar140._8_4_ = uVar229;
              auVar140._12_4_ = uVar229;
              auVar90 = auVar247._0_16_;
              auVar87 = vfmadd132ps_fma(auVar140,auVar90,local_640._0_16_);
              fVar239 = auVar243._0_4_;
              fVar238 = 1.0 - fVar239;
              fVar237 = fVar238 * fVar238 * fVar238;
              fVar235 = fVar239 * fVar239;
              fVar158 = fVar239 * fVar235;
              auVar241 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar237),
                                         ZEXT416((uint)fVar158));
              fVar236 = fVar239 * fVar238;
              local_820._0_16_ = ZEXT416((uint)fVar238);
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar236 * 6.0)),
                                       ZEXT416((uint)(fVar236 * fVar238)),
                                       SUB6416(ZEXT464(0x41400000),0));
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar158),
                                        ZEXT416((uint)fVar237));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar238 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar239 * fVar236)));
              fVar237 = fVar237 * 0.16666667;
              fVar238 = (auVar241._0_4_ + auVar7._0_4_) * 0.16666667;
              fVar239 = (auVar88._0_4_ + auVar86._0_4_) * 0.16666667;
              fVar158 = fVar158 * 0.16666667;
              auVar186._0_4_ = fVar158 * (float)local_6e0._0_4_;
              auVar186._4_4_ = fVar158 * (float)local_6e0._4_4_;
              auVar186._8_4_ = fVar158 * fStack_6d8;
              auVar186._12_4_ = fVar158 * fStack_6d4;
              auVar209._4_4_ = fVar239;
              auVar209._0_4_ = fVar239;
              auVar209._8_4_ = fVar239;
              auVar209._12_4_ = fVar239;
              auVar241 = vfmadd132ps_fma(auVar209,auVar186,local_6a0._0_16_);
              auVar187._4_4_ = fVar238;
              auVar187._0_4_ = fVar238;
              auVar187._8_4_ = fVar238;
              auVar187._12_4_ = fVar238;
              auVar241 = vfmadd132ps_fma(auVar187,auVar241,local_6c0._0_16_);
              auVar168._4_4_ = fVar237;
              auVar168._0_4_ = fVar237;
              auVar168._8_4_ = fVar237;
              auVar168._12_4_ = fVar237;
              local_5b0 = vfmadd132ps_fma(auVar168,auVar241,local_680._0_16_);
              auVar87 = vsubps_avx(auVar87,local_5b0);
              local_700._0_16_ = auVar87;
              auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
              local_880._0_16_ = auVar243._0_16_;
              local_720._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_860._0_4_ = fVar235;
                auVar206._0_4_ = sqrtf(auVar87._0_4_);
                auVar206._4_60_ = extraout_var_01;
                auVar90 = ZEXT816(0) << 0x40;
                auVar87 = auVar206._0_16_;
                auVar241 = local_880._0_16_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_860._0_4_ = fVar235;
                auVar241 = auVar243._0_16_;
              }
              local_5c0 = local_820._0_4_;
              fStack_5bc = local_5c0;
              fStack_5b8 = local_5c0;
              fStack_5b4 = local_5c0;
              auVar88 = vfnmsub213ss_fma(auVar241,auVar241,ZEXT416((uint)(fVar236 * 4.0)));
              auVar241 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * 4.0)),local_820._0_16_,
                                         local_820._0_16_);
              fVar235 = local_5c0 * -local_5c0 * 0.5;
              fVar236 = auVar88._0_4_ * 0.5;
              fVar237 = auVar241._0_4_ * 0.5;
              local_860._0_4_ = (float)local_860._0_4_ * 0.5;
              auVar201._0_4_ = (float)local_860._0_4_ * (float)local_6e0._0_4_;
              auVar201._4_4_ = (float)local_860._0_4_ * (float)local_6e0._4_4_;
              auVar201._8_4_ = (float)local_860._0_4_ * fStack_6d8;
              auVar201._12_4_ = (float)local_860._0_4_ * fStack_6d4;
              auVar169._4_4_ = fVar237;
              auVar169._0_4_ = fVar237;
              auVar169._8_4_ = fVar237;
              auVar169._12_4_ = fVar237;
              auVar241 = vfmadd132ps_fma(auVar169,auVar201,local_6a0._0_16_);
              auVar188._4_4_ = fVar236;
              auVar188._0_4_ = fVar236;
              auVar188._8_4_ = fVar236;
              auVar188._12_4_ = fVar236;
              auVar241 = vfmadd132ps_fma(auVar188,auVar241,local_6c0._0_16_);
              auVar252._4_4_ = fVar235;
              auVar252._0_4_ = fVar235;
              auVar252._8_4_ = fVar235;
              auVar252._12_4_ = fVar235;
              local_860 = vfmadd132ps_fma(auVar252,auVar241,local_680._0_16_);
              local_5d0 = vdpps_avx(local_860,local_860,0x7f);
              fVar236 = local_5d0._0_4_;
              auVar170._4_12_ = auVar90._4_12_;
              auVar170._0_4_ = fVar236;
              local_7e0 = vrsqrt14ss_avx512f(auVar90,auVar170);
              fVar235 = local_7e0._0_4_ * 1.5;
              local_5e0 = vrcp14ss_avx512f(auVar90,auVar170);
              auVar241 = vfnmadd213ss_fma(local_5e0,local_5d0,ZEXT416(0x40000000));
              uVar85 = auVar87._0_4_;
              if (fVar236 < -fVar236) {
                local_7f0._0_4_ = fVar235;
                auVar232._0_4_ = sqrtf(fVar236);
                auVar232._4_60_ = extraout_var_02;
                auVar87 = ZEXT416(uVar85);
                auVar90 = ZEXT816(0) << 0x40;
                auVar88 = auVar232._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx512f(local_5d0,local_5d0);
                local_7f0._0_4_ = fVar235;
              }
              fVar235 = local_7e0._0_4_;
              fVar235 = (float)local_7f0._0_4_ + fVar236 * -0.5 * fVar235 * fVar235 * fVar235;
              local_7f0._0_4_ = local_860._0_4_ * fVar235;
              local_7f0._4_4_ = local_860._4_4_ * fVar235;
              local_7f0._8_4_ = local_860._8_4_ * fVar235;
              local_7f0._12_4_ = local_860._12_4_ * fVar235;
              local_7e0 = vdpps_avx(local_700._0_16_,local_7f0,0x7f);
              fVar237 = auVar87._0_4_;
              auVar141._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar141._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar141._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar141._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar7 = vsubps_avx(local_720._0_16_,auVar141);
              fVar236 = auVar7._0_4_;
              auVar171._4_12_ = auVar90._4_12_;
              auVar171._0_4_ = fVar236;
              auVar86 = vrsqrt14ss_avx512f(auVar90,auVar171);
              auVar90 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
              auVar92 = vmulss_avx512f(auVar7,ZEXT416(0xbf000000));
              if (fVar236 < 0.0) {
                local_600 = fVar235;
                fStack_5fc = fVar235;
                fStack_5f8 = fVar235;
                fStack_5f4 = fVar235;
                local_5f0 = auVar86;
                fVar236 = sqrtf(fVar236);
                auVar92 = ZEXT416(auVar92._0_4_);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar87 = ZEXT416(uVar85);
                auVar86 = local_5f0;
                fVar235 = local_600;
                fVar238 = fStack_5fc;
                fVar239 = fStack_5f8;
                fVar158 = fStack_5f4;
              }
              else {
                auVar7 = vsqrtss_avx(auVar7,auVar7);
                fVar236 = auVar7._0_4_;
                fVar238 = fVar235;
                fVar239 = fVar235;
                fVar158 = fVar235;
              }
              auVar250 = ZEXT1664(local_720._0_16_);
              auVar231._8_4_ = 0x7fffffff;
              auVar231._0_8_ = 0x7fffffff7fffffff;
              auVar231._12_4_ = 0x7fffffff;
              auVar232 = ZEXT1664(auVar231);
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,
                                        local_880._0_16_);
              auVar7 = vfmadd231ss_fma(local_820._0_16_,local_880._0_16_,
                                       SUB6416(ZEXT464(0xc0000000),0));
              fVar240 = local_880._0_4_;
              auVar189._0_4_ = fVar240 * (float)local_6e0._0_4_;
              auVar189._4_4_ = fVar240 * (float)local_6e0._4_4_;
              auVar189._8_4_ = fVar240 * fStack_6d8;
              auVar189._12_4_ = fVar240 * fStack_6d4;
              auVar202._0_4_ = auVar7._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar7 = vfmadd132ps_fma(auVar202,auVar189,local_6a0._0_16_);
              auVar172._0_4_ = auVar91._0_4_;
              auVar172._4_4_ = auVar172._0_4_;
              auVar172._8_4_ = auVar172._0_4_;
              auVar172._12_4_ = auVar172._0_4_;
              auVar7 = vfmadd132ps_fma(auVar172,auVar7,local_6c0._0_16_);
              auVar66._4_4_ = fStack_5bc;
              auVar66._0_4_ = local_5c0;
              auVar66._8_4_ = fStack_5b8;
              auVar66._12_4_ = fStack_5b4;
              auVar7 = vfmadd132ps_fma(auVar66,auVar7,local_680._0_16_);
              auVar173._0_4_ = auVar7._0_4_ * (float)local_5d0._0_4_;
              auVar173._4_4_ = auVar7._4_4_ * (float)local_5d0._0_4_;
              auVar173._8_4_ = auVar7._8_4_ * (float)local_5d0._0_4_;
              auVar173._12_4_ = auVar7._12_4_ * (float)local_5d0._0_4_;
              auVar7 = vdpps_avx(local_860,auVar7,0x7f);
              fVar198 = auVar7._0_4_;
              auVar190._0_4_ = local_860._0_4_ * fVar198;
              auVar190._4_4_ = local_860._4_4_ * fVar198;
              auVar190._8_4_ = local_860._8_4_ * fVar198;
              auVar190._12_4_ = local_860._12_4_ * fVar198;
              auVar7 = vsubps_avx(auVar173,auVar190);
              fVar198 = auVar241._0_4_ * (float)local_5e0._0_4_;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar93 = vxorps_avx512vl(local_860,auVar24);
              auVar210._0_4_ = fVar235 * auVar7._0_4_ * fVar198;
              auVar210._4_4_ = fVar238 * auVar7._4_4_ * fVar198;
              auVar210._8_4_ = fVar239 * auVar7._8_4_ * fVar198;
              auVar210._12_4_ = fVar158 * auVar7._12_4_ * fVar198;
              auVar241 = vdpps_avx(auVar93,local_7f0,0x7f);
              auVar7 = vmaxss_avx(ZEXT416((uint)fVar233),
                                  ZEXT416((uint)((float)local_840._0_4_ * fVar135 * 1.9073486e-06)))
              ;
              auVar91 = vdivss_avx512f(ZEXT416((uint)fVar233),auVar88);
              auVar88 = vdpps_avx(local_700._0_16_,auVar210,0x7f);
              auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar233),auVar7);
              auVar91 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),auVar91,auVar87);
              auVar87 = vdpps_avx(local_640._0_16_,local_7f0,0x7f);
              fVar235 = auVar241._0_4_ + auVar88._0_4_;
              auVar241 = vdpps_avx(local_700._0_16_,auVar93,0x7f);
              auVar92 = vmulss_avx512f(auVar92,auVar86);
              auVar86 = vmulss_avx512f(auVar86,auVar86);
              auVar88 = vdpps_avx(local_700._0_16_,local_640._0_16_,0x7f);
              auVar86 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar92._0_4_ * auVar86._0_4_)));
              auVar90 = vfnmadd231ss_avx512f(auVar241,local_7e0,ZEXT416((uint)fVar235));
              auVar92 = vfnmadd231ss_avx512f(auVar88,local_7e0,auVar87);
              auVar241 = vpermilps_avx(local_5b0,0xff);
              fVar236 = fVar236 - auVar241._0_4_;
              auVar241 = vshufps_avx(local_860,local_860,0xff);
              auVar88 = vfmsub213ss_fma(auVar90,auVar86,auVar241);
              fVar237 = auVar92._0_4_ * auVar86._0_4_;
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar235),ZEXT416((uint)fVar237));
              fVar238 = auVar86._0_4_;
              auVar222._0_4_ = fVar237 / fVar238;
              auVar222._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar219._0_4_ = auVar88._0_4_ / fVar238;
              auVar219._4_12_ = auVar88._4_12_;
              auVar88 = vmulss_avx512f(local_7e0,auVar222);
              auVar86 = vmulss_avx512f(local_7e0,auVar219);
              auVar220 = ZEXT1664(auVar86);
              fVar240 = fVar240 - (auVar88._0_4_ - fVar236 * (auVar87._0_4_ / fVar238));
              auVar243 = ZEXT464((uint)fVar240);
              fVar235 = (float)local_840._0_4_ - (fVar236 * (fVar235 / fVar238) - auVar86._0_4_);
              auVar234 = ZEXT464((uint)fVar235);
              auVar97._0_16_ = vandps_avx512vl(local_7e0,auVar231);
              auVar97._16_16_ = auVar89;
              if (auVar91._0_4_ <= auVar97._0_4_) {
                bVar11 = false;
                auVar247 = ZEXT864(0) << 0x20;
              }
              else {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ + auVar7._0_4_)),local_620,
                                          ZEXT416(0x36000000));
                auVar87 = vandps_avx(auVar231,ZEXT416((uint)fVar236));
                auVar63._12_4_ = 0;
                auVar63._0_12_ = ZEXT812(0);
                auVar247 = ZEXT1264(ZEXT812(0)) << 0x20;
                if (auVar88._0_4_ <= auVar87._0_4_) {
                  bVar11 = false;
                }
                else {
                  fVar235 = fVar235 + (float)local_610._0_4_;
                  auVar234 = ZEXT464((uint)fVar235);
                  bVar11 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar235) &&
                       (fVar236 = (ray->super_RayK<1>).tfar, fVar235 <= fVar236)) &&
                      (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                    auVar97._0_16_ =
                         vrsqrt14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)local_720._0_4_));
                    fVar237 = auVar97._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_888].ptr;
                    if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar237 = fVar237 * 1.5 + local_720._0_4_ * -0.5 * fVar237 * fVar237 * fVar237
                      ;
                      auVar174._0_4_ = local_700._0_4_ * fVar237;
                      auVar174._4_4_ = local_700._4_4_ * fVar237;
                      auVar174._8_4_ = local_700._8_4_ * fVar237;
                      auVar174._12_4_ = local_700._12_4_ * fVar237;
                      auVar7 = vfmadd213ps_fma(auVar241,auVar174,local_860);
                      auVar87 = vshufps_avx(auVar174,auVar174,0xc9);
                      auVar241 = vshufps_avx(local_860,local_860,0xc9);
                      auVar175._0_4_ = auVar174._0_4_ * auVar241._0_4_;
                      auVar175._4_4_ = auVar174._4_4_ * auVar241._4_4_;
                      auVar175._8_4_ = auVar174._8_4_ * auVar241._8_4_;
                      auVar175._12_4_ = auVar174._12_4_ * auVar241._12_4_;
                      auVar88 = vfmsub231ps_fma(auVar175,local_860,auVar87);
                      auVar87 = vshufps_avx(auVar88,auVar88,0xc9);
                      auVar241 = vshufps_avx(auVar7,auVar7,0xc9);
                      auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                      auVar142._0_4_ = auVar7._0_4_ * auVar88._0_4_;
                      auVar142._4_4_ = auVar7._4_4_ * auVar88._4_4_;
                      auVar142._8_4_ = auVar7._8_4_ * auVar88._8_4_;
                      auVar142._12_4_ = auVar7._12_4_ * auVar88._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar142,auVar87,auVar241);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar235;
                        auVar241 = vshufps_avx(auVar87,auVar87,0xe9);
                        uVar20 = vmovlps_avx(auVar241);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                        (ray->Ng).field_0.field_0.z = auVar87._0_4_;
                        ray->u = fVar240;
                        ray->v = 0.0;
                        ray->primID = (uint)local_848;
                        ray->geomID = (uint)local_888;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar241 = vshufps_avx(auVar87,auVar87,0xe9);
                        local_770 = vmovlps_avx(auVar241);
                        local_768 = auVar87._0_4_;
                        local_764 = fVar240;
                        local_760 = 0;
                        local_75c = (uint)local_848;
                        local_758 = (uint)local_888;
                        local_754 = context->user->instID[0];
                        local_750 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar235;
                        local_88c = -1;
                        local_7c0.valid = &local_88c;
                        local_7c0.geometryUserPtr = pGVar9->userPtr;
                        local_7c0.context = context->user;
                        local_7c0.ray = (RTCRayN *)ray;
                        local_7c0.hit = (RTCHitN *)&local_770;
                        local_7c0.N = 1;
                        local_880._0_16_ = ZEXT416((uint)fVar240);
                        local_840._0_16_ = ZEXT416((uint)fVar235);
                        local_820._0_4_ = fVar236;
                        if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01e0530d:
                          p_Var10 = context->args->filter;
                          if (p_Var10 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              auVar220 = ZEXT1664(auVar220._0_16_);
                              auVar232 = ZEXT1664(auVar232._0_16_);
                              auVar250 = ZEXT1664(auVar250._0_16_);
                              (*p_Var10)(&local_7c0);
                              auVar234 = ZEXT1664(local_840._0_16_);
                              auVar243 = ZEXT1664(local_880._0_16_);
                              auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
                              fVar236 = (float)local_820._0_4_;
                            }
                            if (*local_7c0.valid == 0) goto LAB_01e053bd;
                          }
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).components[0] =
                               *(float *)local_7c0.hit;
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_7c0.hit + 4);
                          (((Vec3f *)((long)local_7c0.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_7c0.hit + 8);
                          *(float *)((long)local_7c0.ray + 0x3c) = *(float *)(local_7c0.hit + 0xc);
                          *(float *)((long)local_7c0.ray + 0x40) = *(float *)(local_7c0.hit + 0x10);
                          *(float *)((long)local_7c0.ray + 0x44) = *(float *)(local_7c0.hit + 0x14);
                          *(float *)((long)local_7c0.ray + 0x48) = *(float *)(local_7c0.hit + 0x18);
                          *(float *)((long)local_7c0.ray + 0x4c) = *(float *)(local_7c0.hit + 0x1c);
                          *(float *)((long)local_7c0.ray + 0x50) = *(float *)(local_7c0.hit + 0x20);
                        }
                        else {
                          auVar220 = ZEXT1664(auVar86);
                          auVar232 = ZEXT1664(auVar231);
                          auVar250 = ZEXT1664(local_720._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_7c0);
                          auVar234 = ZEXT1664(local_840._0_16_);
                          auVar243 = ZEXT1664(local_880._0_16_);
                          auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar236 = (float)local_820._0_4_;
                          if (*local_7c0.valid != 0) goto LAB_01e0530d;
LAB_01e053bd:
                          (ray->super_RayK<1>).tfar = fVar236;
                        }
                      }
                    }
                  }
                }
              }
              bVar83 = lVar82 != 0;
              lVar82 = lVar82 + -1;
            } while ((!bVar11) && (bVar83));
            auVar71._4_4_ = fStack_4fc;
            auVar71._0_4_ = local_500;
            auVar71._8_4_ = fStack_4f8;
            auVar71._12_4_ = fStack_4f4;
            auVar71._16_4_ = fStack_4f0;
            auVar71._20_4_ = fStack_4ec;
            auVar71._24_4_ = fStack_4e8;
            auVar71._28_4_ = fStack_4e4;
            fVar135 = (ray->super_RayK<1>).tfar;
            auVar37._4_4_ = fVar135;
            auVar37._0_4_ = fVar135;
            auVar37._8_4_ = fVar135;
            auVar37._12_4_ = fVar135;
            auVar37._16_4_ = fVar135;
            auVar37._20_4_ = fVar135;
            auVar37._24_4_ = fVar135;
            auVar37._28_4_ = fVar135;
            uVar20 = vcmpps_avx512vl(auVar71,auVar37,2);
            bVar80 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar80 & (byte)uVar20;
          } while (bVar80 != 0);
        }
        uVar21 = vpcmpd_avx512vl(local_4a0,_local_580,1);
        uVar22 = vpcmpd_avx512vl(local_4a0,local_3e0,1);
        auVar179._0_4_ = (float)local_660._0_4_ + (float)local_460._0_4_;
        auVar179._4_4_ = (float)local_660._4_4_ + (float)local_460._4_4_;
        auVar179._8_4_ = fStack_658 + fStack_458;
        auVar179._12_4_ = fStack_654 + fStack_454;
        auVar179._16_4_ = fStack_650 + fStack_450;
        auVar179._20_4_ = fStack_64c + fStack_44c;
        auVar179._24_4_ = fStack_648 + fStack_448;
        auVar179._28_4_ = fStack_644 + fStack_444;
        fVar233 = (ray->super_RayK<1>).tfar;
        auVar194._4_4_ = fVar233;
        auVar194._0_4_ = fVar233;
        auVar194._8_4_ = fVar233;
        auVar194._12_4_ = fVar233;
        auVar194._16_4_ = fVar233;
        auVar194._20_4_ = fVar233;
        auVar194._24_4_ = fVar233;
        auVar194._28_4_ = fVar233;
        uVar20 = vcmpps_avx512vl(auVar179,auVar194,2);
        bVar80 = (byte)local_788 & (byte)uVar22 & (byte)uVar20;
        auVar205._0_4_ = (float)local_660._0_4_ + (float)local_420._0_4_;
        auVar205._4_4_ = (float)local_660._4_4_ + (float)local_420._4_4_;
        auVar205._8_4_ = fStack_658 + fStack_418;
        auVar205._12_4_ = fStack_654 + fStack_414;
        auVar205._16_4_ = fStack_650 + fStack_410;
        auVar205._20_4_ = fStack_64c + fStack_40c;
        auVar205._24_4_ = fStack_648 + fStack_408;
        auVar205._28_4_ = fStack_644 + fStack_404;
        uVar20 = vcmpps_avx512vl(auVar205,auVar194,2);
        bVar76 = bVar76 & (byte)uVar21 & (byte)uVar20 | bVar80;
        prim = local_738;
        if (bVar76 == 0) {
          auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          uVar84 = local_7c8 & 0xffffffff;
          abStack_180[uVar84 * 0x60] = bVar76;
          auVar97._0_4_ =
               (uint)(bVar80 & 1) * local_460._0_4_ | (uint)!(bool)(bVar80 & 1) * local_420._0_4_;
          bVar11 = (bool)(bVar80 >> 1 & 1);
          auVar97._4_4_ = (uint)bVar11 * local_460._4_4_ | (uint)!bVar11 * local_420._4_4_;
          bVar11 = (bool)(bVar80 >> 2 & 1);
          auVar97._8_4_ = (uint)bVar11 * (int)fStack_458 | (uint)!bVar11 * (int)fStack_418;
          bVar11 = (bool)(bVar80 >> 3 & 1);
          auVar97._12_4_ = (uint)bVar11 * (int)fStack_454 | (uint)!bVar11 * (int)fStack_414;
          bVar11 = (bool)(bVar80 >> 4 & 1);
          auVar97._16_4_ = (uint)bVar11 * (int)fStack_450 | (uint)!bVar11 * (int)fStack_410;
          bVar11 = (bool)(bVar80 >> 5 & 1);
          auVar97._20_4_ = (uint)bVar11 * (int)fStack_44c | (uint)!bVar11 * (int)fStack_40c;
          bVar11 = (bool)(bVar80 >> 6 & 1);
          auVar97._24_4_ = (uint)bVar11 * (int)fStack_448 | (uint)!bVar11 * (int)fStack_408;
          auVar97._28_4_ =
               (uint)(bVar80 >> 7) * (int)fStack_444 | (uint)!(bool)(bVar80 >> 7) * (int)fStack_404;
          *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x60) = auVar97;
          uVar20 = vmovlps_avx(local_780);
          *(undefined8 *)(afStack_140 + uVar84 * 0x18) = uVar20;
          auStack_138[uVar84 * 0x18] = (int)local_730 + 1;
          local_7c8 = (ulong)((int)local_7c8 + 1);
          auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
      }
    }
    auVar216 = ZEXT1664(local_780);
    fVar233 = (ray->super_RayK<1>).tfar;
    auVar146._4_4_ = fVar233;
    auVar146._0_4_ = fVar233;
    auVar146._8_4_ = fVar233;
    auVar146._12_4_ = fVar233;
    auVar146._16_4_ = fVar233;
    auVar146._20_4_ = fVar233;
    auVar146._24_4_ = fVar233;
    auVar146._28_4_ = fVar233;
    local_7c8 = local_7c8 & 0xffffffff;
    do {
      if ((int)local_7c8 == 0) {
        fVar233 = (ray->super_RayK<1>).tfar;
        auVar38._4_4_ = fVar233;
        auVar38._0_4_ = fVar233;
        auVar38._8_4_ = fVar233;
        auVar38._12_4_ = fVar233;
        auVar38._16_4_ = fVar233;
        auVar38._20_4_ = fVar233;
        auVar38._24_4_ = fVar233;
        auVar38._28_4_ = fVar233;
        uVar20 = vcmpps_avx512vl(local_3c0,auVar38,2);
        uVar85 = (uint)local_728 & (uint)uVar20;
        local_728 = (ulong)uVar85;
        if (uVar85 == 0) {
          return;
        }
        goto LAB_01e02f5c;
      }
      uVar84 = (ulong)((int)local_7c8 - 1);
      lVar82 = uVar84 * 0x60;
      auVar99 = *(undefined1 (*) [32])(auStack_160 + lVar82);
      auVar191._0_4_ = (float)local_660._0_4_ + auVar99._0_4_;
      auVar191._4_4_ = (float)local_660._4_4_ + auVar99._4_4_;
      auVar191._8_4_ = fStack_658 + auVar99._8_4_;
      auVar191._12_4_ = fStack_654 + auVar99._12_4_;
      auVar191._16_4_ = fStack_650 + auVar99._16_4_;
      auVar191._20_4_ = fStack_64c + auVar99._20_4_;
      auVar191._24_4_ = fStack_648 + auVar99._24_4_;
      auVar191._28_4_ = fStack_644 + auVar99._28_4_;
      uVar20 = vcmpps_avx512vl(auVar191,auVar146,2);
      uVar85 = (uint)uVar20 & (uint)abStack_180[lVar82];
      bVar76 = (byte)uVar85;
      if (uVar85 != 0) {
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar100 = vblendmps_avx512vl(auVar193,auVar99);
        auVar97._0_4_ =
             (uint)(bVar76 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar76 & 1) * (int)auVar99._0_4_;
        bVar11 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar97._4_4_ = (uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * (int)auVar99._4_4_;
        bVar11 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar97._8_4_ = (uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * (int)auVar99._8_4_;
        bVar11 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar97._12_4_ = (uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * (int)auVar99._12_4_;
        bVar11 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar97._16_4_ = (uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * (int)auVar99._16_4_;
        bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar97._20_4_ = (uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * (int)auVar99._20_4_;
        bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar97._24_4_ = (uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * (int)auVar99._24_4_;
        auVar97._28_4_ =
             (uVar85 >> 7) * auVar100._28_4_ | (uint)!SUB41(uVar85 >> 7,0) * (int)auVar99._28_4_;
        auVar99 = vshufps_avx(auVar97,auVar97,0xb1);
        auVar99 = vminps_avx(auVar97,auVar99);
        auVar100 = vshufpd_avx(auVar99,auVar99,5);
        auVar99 = vminps_avx(auVar99,auVar100);
        auVar100 = vpermpd_avx2(auVar99,0x4e);
        auVar99 = vminps_avx(auVar99,auVar100);
        uVar20 = vcmpps_avx512vl(auVar97,auVar99,0);
        bVar80 = (byte)uVar20 & bVar76;
        if (bVar80 != 0) {
          uVar85 = (uint)bVar80;
        }
        fVar233 = afStack_140[uVar84 * 0x18 + 1];
        uVar128 = 0;
        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
          uVar128 = uVar128 + 1;
        }
        local_730 = (ulong)auStack_138[uVar84 * 0x18];
        bVar80 = ~('\x01' << ((byte)uVar128 & 0x1f)) & bVar76;
        abStack_180[lVar82] = bVar80;
        auVar206 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        uVar81 = uVar84;
        if (bVar80 != 0) {
          uVar81 = local_7c8;
        }
        fVar135 = afStack_140[uVar84 * 0x18];
        auVar191._4_4_ = fVar135;
        auVar191._0_4_ = fVar135;
        auVar191._8_4_ = fVar135;
        auVar191._12_4_ = fVar135;
        auVar191._16_4_ = fVar135;
        auVar191._20_4_ = fVar135;
        auVar191._24_4_ = fVar135;
        auVar191._28_4_ = fVar135;
        fVar233 = fVar233 - fVar135;
        auVar178._4_4_ = fVar233;
        auVar178._0_4_ = fVar233;
        auVar178._8_4_ = fVar233;
        auVar178._12_4_ = fVar233;
        auVar178._16_4_ = fVar233;
        auVar178._20_4_ = fVar233;
        auVar178._24_4_ = fVar233;
        auVar178._28_4_ = fVar233;
        auVar87 = vfmadd132ps_fma(auVar178,auVar191,_DAT_02020f20);
        _local_460 = ZEXT1632(auVar87);
        auVar216 = ZEXT864(*(ulong *)(local_460 + (ulong)uVar128 * 4));
        uVar84 = uVar81;
      }
      local_7c8 = uVar84;
    } while (bVar76 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }